

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  bool bVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  uint uVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  long lVar56;
  byte bVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  float fVar61;
  vint4 bi_2;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined4 uVar62;
  undefined1 auVar68 [16];
  float fVar63;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar94;
  vint4 bi_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar93;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 extraout_var [56];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  vint4 ai_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  vint4 ai;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar148;
  float fVar149;
  vint4 bi;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar150;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar147 [32];
  float fVar154;
  undefined8 uVar155;
  float fVar175;
  vfloat4 b0_1;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar173;
  float fVar176;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar174;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  vint4 ai_1;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  vfloat4 a0_2;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  vfloat4 a0_3;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [32];
  float fVar240;
  float fVar251;
  float fVar252;
  vfloat4 a0_1;
  undefined1 auVar241 [16];
  float fVar253;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  vfloat4 a0;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar273 [16];
  undefined1 auVar277 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_678 [16];
  float local_618;
  float fStack_614;
  undefined1 local_5b8 [8];
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 *local_540;
  RTCFilterFunctionNArguments local_538;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  uint auStack_3d8 [4];
  uint local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  uint local_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar55;
  undefined1 auVar92 [64];
  undefined1 auVar114 [32];
  
  PVar3 = prim[1];
  uVar60 = (ulong)(byte)PVar3;
  fVar61 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar9 = vsubps_avx(auVar9,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  auVar122._0_4_ = fVar61 * auVar9._0_4_;
  auVar122._4_4_ = fVar61 * auVar9._4_4_;
  auVar122._8_4_ = fVar61 * auVar9._8_4_;
  auVar122._12_4_ = fVar61 * auVar9._12_4_;
  auVar133._0_4_ = fVar61 * auVar69._0_4_;
  auVar133._4_4_ = fVar61 * auVar69._4_4_;
  auVar133._8_4_ = fVar61 * auVar69._8_4_;
  auVar133._12_4_ = fVar61 * auVar69._12_4_;
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 5 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar268 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 6 + 6)));
  auVar268 = vcvtdq2ps_avx(auVar268);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar60 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar60 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  uVar54 = (ulong)(uint)((int)(uVar60 * 9) * 2);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  auVar64 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + uVar60 + 6)));
  auVar64 = vcvtdq2ps_avx(auVar64);
  uVar54 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar54 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar264._4_4_ = auVar133._0_4_;
  auVar264._0_4_ = auVar133._0_4_;
  auVar264._8_4_ = auVar133._0_4_;
  auVar264._12_4_ = auVar133._0_4_;
  auVar73 = vshufps_avx(auVar133,auVar133,0x55);
  auVar201 = vshufps_avx(auVar133,auVar133,0xaa);
  fVar61 = auVar201._0_4_;
  auVar232._0_4_ = fVar61 * auVar268._0_4_;
  fVar132 = auVar201._4_4_;
  auVar232._4_4_ = fVar132 * auVar268._4_4_;
  fVar148 = auVar201._8_4_;
  auVar232._8_4_ = fVar148 * auVar268._8_4_;
  fVar149 = auVar201._12_4_;
  auVar232._12_4_ = fVar149 * auVar268._12_4_;
  auVar220._0_4_ = auVar12._0_4_ * fVar61;
  auVar220._4_4_ = auVar12._4_4_ * fVar132;
  auVar220._8_4_ = auVar12._8_4_ * fVar148;
  auVar220._12_4_ = auVar12._12_4_ * fVar149;
  auVar194._0_4_ = auVar95._0_4_ * fVar61;
  auVar194._4_4_ = auVar95._4_4_ * fVar132;
  auVar194._8_4_ = auVar95._8_4_ * fVar148;
  auVar194._12_4_ = auVar95._12_4_ * fVar149;
  auVar201 = vfmadd231ps_fma(auVar232,auVar73,auVar69);
  auVar74 = vfmadd231ps_fma(auVar220,auVar73,auVar11);
  auVar73 = vfmadd231ps_fma(auVar194,auVar64,auVar73);
  auVar106 = vfmadd231ps_fma(auVar201,auVar264,auVar9);
  auVar74 = vfmadd231ps_fma(auVar74,auVar264,auVar10);
  auVar118 = vfmadd231ps_fma(auVar73,auVar65,auVar264);
  auVar265._4_4_ = auVar122._0_4_;
  auVar265._0_4_ = auVar122._0_4_;
  auVar265._8_4_ = auVar122._0_4_;
  auVar265._12_4_ = auVar122._0_4_;
  auVar73 = vshufps_avx(auVar122,auVar122,0x55);
  auVar201 = vshufps_avx(auVar122,auVar122,0xaa);
  fVar61 = auVar201._0_4_;
  auVar134._0_4_ = fVar61 * auVar268._0_4_;
  fVar132 = auVar201._4_4_;
  auVar134._4_4_ = fVar132 * auVar268._4_4_;
  fVar148 = auVar201._8_4_;
  auVar134._8_4_ = fVar148 * auVar268._8_4_;
  fVar149 = auVar201._12_4_;
  auVar134._12_4_ = fVar149 * auVar268._12_4_;
  auVar72._0_4_ = auVar12._0_4_ * fVar61;
  auVar72._4_4_ = auVar12._4_4_ * fVar132;
  auVar72._8_4_ = auVar12._8_4_ * fVar148;
  auVar72._12_4_ = auVar12._12_4_ * fVar149;
  auVar201._0_4_ = auVar95._0_4_ * fVar61;
  auVar201._4_4_ = auVar95._4_4_ * fVar132;
  auVar201._8_4_ = auVar95._8_4_ * fVar148;
  auVar201._12_4_ = auVar95._12_4_ * fVar149;
  auVar69 = vfmadd231ps_fma(auVar134,auVar73,auVar69);
  auVar268 = vfmadd231ps_fma(auVar72,auVar73,auVar11);
  auVar11 = vfmadd231ps_fma(auVar201,auVar73,auVar64);
  auVar12 = vfmadd231ps_fma(auVar69,auVar265,auVar9);
  auVar64 = vfmadd231ps_fma(auVar268,auVar265,auVar10);
  auVar95 = vfmadd231ps_fma(auVar11,auVar265,auVar65);
  auVar273._8_4_ = 0x7fffffff;
  auVar273._0_8_ = 0x7fffffff7fffffff;
  auVar273._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx(auVar106,auVar273);
  auVar117._8_4_ = 0x219392ef;
  auVar117._0_8_ = 0x219392ef219392ef;
  auVar117._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar117,1);
  auVar69 = vblendvps_avx(auVar106,auVar117,auVar9);
  auVar9 = vandps_avx(auVar74,auVar273);
  auVar9 = vcmpps_avx(auVar9,auVar117,1);
  auVar268 = vblendvps_avx(auVar74,auVar117,auVar9);
  auVar9 = vandps_avx(auVar118,auVar273);
  auVar9 = vcmpps_avx(auVar9,auVar117,1);
  auVar9 = vblendvps_avx(auVar118,auVar117,auVar9);
  auVar10 = vrcpps_avx(auVar69);
  auVar180._8_4_ = 0x3f800000;
  auVar180._0_8_ = &DAT_3f8000003f800000;
  auVar180._12_4_ = 0x3f800000;
  auVar69 = vfnmadd213ps_fma(auVar69,auVar10,auVar180);
  auVar10 = vfmadd132ps_fma(auVar69,auVar10,auVar10);
  auVar69 = vrcpps_avx(auVar268);
  auVar268 = vfnmadd213ps_fma(auVar268,auVar69,auVar180);
  auVar11 = vfmadd132ps_fma(auVar268,auVar69,auVar69);
  auVar69 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar69,auVar180);
  auVar65 = vfmadd132ps_fma(auVar9,auVar69,auVar69);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar60 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar12);
  auVar118._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar118._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar118._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar118._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar60 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar69);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar12);
  auVar135._0_4_ = auVar10._0_4_ * auVar9._0_4_;
  auVar135._4_4_ = auVar10._4_4_ * auVar9._4_4_;
  auVar135._8_4_ = auVar10._8_4_ * auVar9._8_4_;
  auVar135._12_4_ = auVar10._12_4_ * auVar9._12_4_;
  auVar74._1_3_ = 0;
  auVar74[0] = PVar3;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar69 = vpmovsxwd_avx(auVar268);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar60 * -2 + 6);
  auVar9 = vpmovsxwd_avx(auVar10);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar195._0_4_ = auVar9._0_4_ * auVar11._0_4_;
  auVar195._4_4_ = auVar9._4_4_ * auVar11._4_4_;
  auVar195._8_4_ = auVar9._8_4_ * auVar11._8_4_;
  auVar195._12_4_ = auVar9._12_4_ * auVar11._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar69);
  auVar9 = vsubps_avx(auVar9,auVar64);
  auVar73._0_4_ = auVar11._0_4_ * auVar9._0_4_;
  auVar73._4_4_ = auVar11._4_4_ * auVar9._4_4_;
  auVar73._8_4_ = auVar11._8_4_ * auVar9._8_4_;
  auVar73._12_4_ = auVar11._12_4_ * auVar9._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar54 + uVar60 + 6);
  auVar9 = vpmovsxwd_avx(auVar11);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar95);
  auVar106._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar106._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar106._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar106._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar60 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar12);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar95);
  auVar64._0_4_ = auVar65._0_4_ * auVar9._0_4_;
  auVar64._4_4_ = auVar65._4_4_ * auVar9._4_4_;
  auVar64._8_4_ = auVar65._8_4_ * auVar9._8_4_;
  auVar64._12_4_ = auVar65._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar118,auVar135);
  auVar69 = vpminsd_avx(auVar195,auVar73);
  auVar9 = vmaxps_avx(auVar9,auVar69);
  auVar69 = vpminsd_avx(auVar106,auVar64);
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar210._4_4_ = uVar62;
  auVar210._0_4_ = uVar62;
  auVar210._8_4_ = uVar62;
  auVar210._12_4_ = uVar62;
  auVar69 = vmaxps_avx(auVar69,auVar210);
  auVar9 = vmaxps_avx(auVar9,auVar69);
  local_3a8._0_4_ = auVar9._0_4_ * 0.99999964;
  local_3a8._4_4_ = auVar9._4_4_ * 0.99999964;
  local_3a8._8_4_ = auVar9._8_4_ * 0.99999964;
  local_3a8._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar118,auVar135);
  auVar69 = vpmaxsd_avx(auVar195,auVar73);
  auVar9 = vminps_avx(auVar9,auVar69);
  auVar69 = vpmaxsd_avx(auVar106,auVar64);
  uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar95._4_4_ = uVar62;
  auVar95._0_4_ = uVar62;
  auVar95._8_4_ = uVar62;
  auVar95._12_4_ = uVar62;
  auVar69 = vminps_avx(auVar69,auVar95);
  auVar9 = vminps_avx(auVar9,auVar69);
  auVar65._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar65._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar65._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar65._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar74[4] = PVar3;
  auVar74._5_3_ = 0;
  auVar74[8] = PVar3;
  auVar74._9_3_ = 0;
  auVar74[0xc] = PVar3;
  auVar74._13_3_ = 0;
  auVar69 = vpcmpgtd_avx(auVar74,_DAT_01ff0cf0);
  auVar9 = vcmpps_avx(local_3a8,auVar65,2);
  auVar9 = vandps_avx(auVar9,auVar69);
  uVar51 = vmovmskps_avx(auVar9);
  if (uVar51 == 0) {
    return;
  }
  uVar51 = uVar51 & 0xff;
  auVar71._16_16_ = mm_lookupmask_ps._240_16_;
  auVar71._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar71,ZEXT832(0) << 0x20,0x80);
  local_540 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_0167fb19:
  lVar56 = 0;
  uVar60 = (ulong)uVar51;
  for (uVar54 = uVar60; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar56 = lVar56 + 1;
  }
  uVar51 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar56 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar51].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar12 = *(undefined1 (*) [16])(_Var8 + uVar54 * (long)pvVar7);
  auVar9 = *(undefined1 (*) [16])(_Var8 + (uVar54 + 1) * (long)pvVar7);
  auVar69 = *(undefined1 (*) [16])(_Var8 + (uVar54 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar54 + 3));
  fVar61 = *pfVar1;
  fVar132 = pfVar1[1];
  fVar148 = pfVar1[2];
  fVar149 = pfVar1[3];
  lVar56 = *(long *)&pGVar5[1].time_range.upper;
  auVar268 = *(undefined1 (*) [16])(lVar56 + (long)p_Var6 * uVar54);
  auVar10 = *(undefined1 (*) [16])(lVar56 + (long)p_Var6 * (uVar54 + 1));
  auVar11 = *(undefined1 (*) [16])(lVar56 + (long)p_Var6 * (uVar54 + 2));
  uVar60 = uVar60 - 1 & uVar60;
  pfVar1 = (float *)(lVar56 + (long)p_Var6 * (uVar54 + 3));
  fVar150 = *pfVar1;
  fVar93 = pfVar1[1];
  fVar94 = pfVar1[2];
  fVar63 = pfVar1[3];
  if (uVar60 != 0) {
    uVar59 = uVar60 - 1 & uVar60;
    for (uVar54 = uVar60; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    }
    if (uVar59 != 0) {
      for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar65 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar65 = vinsertps_avx(auVar65,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar75._0_4_ = fVar150 * 0.0;
  auVar75._4_4_ = fVar93 * 0.0;
  auVar75._8_4_ = fVar94 * 0.0;
  auVar75._12_4_ = fVar63 * 0.0;
  auVar266._8_4_ = 0x3e2aaaab;
  auVar266._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar266._12_4_ = 0x3e2aaaab;
  auVar64 = vfmadd213ps_fma(auVar266,auVar11,auVar75);
  auVar196._8_4_ = 0x3f2aaaab;
  auVar196._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar196._12_4_ = 0x3f2aaaab;
  auVar64 = vfmadd231ps_fma(auVar64,auVar10,auVar196);
  auVar95 = vfmadd231ps_fma(auVar64,auVar268,auVar266);
  auVar136._8_4_ = 0x3f000000;
  auVar136._0_8_ = 0x3f0000003f000000;
  auVar136._12_4_ = 0x3f000000;
  auVar64 = vfmadd231ps_fma(auVar75,auVar11,auVar136);
  auVar64 = vfnmadd231ps_fma(auVar64,auVar10,(undefined1  [16])0x0);
  auVar201 = vfnmadd231ps_fma(auVar64,auVar268,auVar136);
  auVar241._0_4_ = fVar61 * 0.0;
  auVar241._4_4_ = fVar132 * 0.0;
  auVar241._8_4_ = fVar148 * 0.0;
  auVar241._12_4_ = fVar149 * 0.0;
  auVar64 = vfmadd213ps_fma(auVar266,auVar69,auVar241);
  auVar64 = vfmadd231ps_fma(auVar64,auVar9,auVar196);
  auVar64 = vfmadd231ps_fma(auVar64,auVar12,auVar266);
  auVar73 = vfmadd231ps_fma(auVar241,auVar69,auVar136);
  auVar73 = vfnmadd231ps_fma(auVar73,auVar9,(undefined1  [16])0x0);
  auVar74 = vfnmadd231ps_fma(auVar73,auVar12,auVar136);
  auVar107._0_4_ = fVar150 * 0.16666667;
  auVar107._4_4_ = fVar93 * 0.16666667;
  auVar107._8_4_ = fVar94 * 0.16666667;
  auVar107._12_4_ = fVar63 * 0.16666667;
  auVar73 = vfmadd231ps_fma(auVar107,auVar11,auVar196);
  auVar73 = vfmadd231ps_fma(auVar73,auVar10,auVar266);
  auVar73 = vfmadd231ps_fma(auVar73,auVar268,(undefined1  [16])0x0);
  auVar119._0_4_ = fVar150 * 0.5;
  auVar119._4_4_ = fVar93 * 0.5;
  auVar119._8_4_ = fVar94 * 0.5;
  auVar119._12_4_ = fVar63 * 0.5;
  auVar11 = vfmadd231ps_fma(auVar119,(undefined1  [16])0x0,auVar11);
  auVar10 = vfnmadd231ps_fma(auVar11,auVar136,auVar10);
  auVar106 = vfnmadd231ps_fma(auVar10,(undefined1  [16])0x0,auVar268);
  auVar211._0_4_ = fVar61 * 0.16666667;
  auVar211._4_4_ = fVar132 * 0.16666667;
  auVar211._8_4_ = fVar148 * 0.16666667;
  auVar211._12_4_ = fVar149 * 0.16666667;
  auVar66._8_4_ = 0x3f2aaaab;
  auVar66._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar66._12_4_ = 0x3f2aaaab;
  auVar268 = vfmadd231ps_fma(auVar211,auVar69,auVar66);
  auVar268 = vfmadd231ps_fma(auVar268,auVar9,auVar266);
  auVar11 = vfmadd231ps_fma(auVar268,auVar12,(undefined1  [16])0x0);
  auVar221._0_4_ = fVar61 * 0.5;
  auVar221._4_4_ = fVar132 * 0.5;
  auVar221._8_4_ = fVar148 * 0.5;
  auVar221._12_4_ = fVar149 * 0.5;
  auVar69 = vfmadd231ps_fma(auVar221,(undefined1  [16])0x0,auVar69);
  auVar9 = vfnmadd231ps_fma(auVar69,auVar136,auVar9);
  auVar12 = vfnmadd231ps_fma(auVar9,(undefined1  [16])0x0,auVar12);
  auVar9 = vshufps_avx(auVar201,auVar201,0xc9);
  auVar69 = vshufps_avx(auVar64,auVar64,0xc9);
  fVar150 = auVar201._0_4_;
  auVar156._0_4_ = fVar150 * auVar69._0_4_;
  fVar93 = auVar201._4_4_;
  auVar156._4_4_ = fVar93 * auVar69._4_4_;
  fVar94 = auVar201._8_4_;
  auVar156._8_4_ = fVar94 * auVar69._8_4_;
  fVar63 = auVar201._12_4_;
  auVar156._12_4_ = fVar63 * auVar69._12_4_;
  auVar69 = vfmsub231ps_fma(auVar156,auVar9,auVar64);
  auVar268 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar69 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar157._0_4_ = fVar150 * auVar69._0_4_;
  auVar157._4_4_ = fVar93 * auVar69._4_4_;
  auVar157._8_4_ = fVar94 * auVar69._8_4_;
  auVar157._12_4_ = fVar63 * auVar69._12_4_;
  auVar9 = vfmsub231ps_fma(auVar157,auVar9,auVar74);
  auVar10 = vshufps_avx(auVar9,auVar9,0xc9);
  auVar9 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar69 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar174 = auVar106._0_4_;
  auVar137._0_4_ = fVar174 * auVar69._0_4_;
  fVar151 = auVar106._4_4_;
  auVar137._4_4_ = fVar151 * auVar69._4_4_;
  fVar152 = auVar106._8_4_;
  auVar137._8_4_ = fVar152 * auVar69._8_4_;
  fVar153 = auVar106._12_4_;
  auVar137._12_4_ = fVar153 * auVar69._12_4_;
  auVar69 = vfmsub231ps_fma(auVar137,auVar9,auVar11);
  auVar11 = vshufps_avx(auVar69,auVar69,0xc9);
  auVar69 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar181._0_4_ = fVar174 * auVar69._0_4_;
  auVar181._4_4_ = fVar151 * auVar69._4_4_;
  auVar181._8_4_ = fVar152 * auVar69._8_4_;
  auVar181._12_4_ = fVar153 * auVar69._12_4_;
  auVar69 = vfmsub231ps_fma(auVar181,auVar9,auVar12);
  auVar9 = vdpps_avx(auVar268,auVar268,0x7f);
  auVar12 = vshufps_avx(auVar69,auVar69,0xc9);
  fVar132 = auVar9._0_4_;
  auVar64 = ZEXT416((uint)fVar132);
  auVar69 = vrsqrtss_avx(auVar64,auVar64);
  fVar61 = auVar69._0_4_;
  auVar69 = vdpps_avx(auVar268,auVar10,0x7f);
  fVar61 = fVar61 * 1.5 + fVar132 * -0.5 * fVar61 * fVar61 * fVar61;
  fVar154 = auVar268._0_4_ * fVar61;
  fVar173 = auVar268._4_4_ * fVar61;
  fVar175 = auVar268._8_4_ * fVar61;
  fVar176 = auVar268._12_4_ * fVar61;
  auVar233._0_4_ = auVar10._0_4_ * fVar132;
  auVar233._4_4_ = auVar10._4_4_ * fVar132;
  auVar233._8_4_ = auVar10._8_4_ * fVar132;
  auVar233._12_4_ = auVar10._12_4_ * fVar132;
  fVar132 = auVar69._0_4_;
  auVar197._0_4_ = auVar268._0_4_ * fVar132;
  auVar197._4_4_ = auVar268._4_4_ * fVar132;
  auVar197._8_4_ = auVar268._8_4_ * fVar132;
  auVar197._12_4_ = auVar268._12_4_ * fVar132;
  auVar10 = vsubps_avx(auVar233,auVar197);
  auVar69 = vrcpss_avx(auVar64,auVar64);
  auVar9 = vfnmadd213ss_fma(auVar9,auVar69,SUB6416(ZEXT464(0x40000000),0));
  fVar148 = auVar69._0_4_ * auVar9._0_4_;
  auVar69 = vdpps_avx(auVar11,auVar11,0x7f);
  auVar9 = vblendps_avx(auVar69,_DAT_01feba10,0xe);
  auVar268 = vrsqrtss_avx(auVar9,auVar9);
  fVar132 = auVar268._0_4_;
  fVar149 = auVar69._0_4_;
  fVar132 = fVar132 * 1.5 + fVar149 * -0.5 * fVar132 * fVar132 * fVar132;
  fVar240 = fVar132 * auVar11._0_4_;
  fVar251 = fVar132 * auVar11._4_4_;
  fVar252 = fVar132 * auVar11._8_4_;
  fVar253 = fVar132 * auVar11._12_4_;
  auVar268 = vdpps_avx(auVar11,auVar12,0x7f);
  auVar182._0_4_ = fVar149 * auVar12._0_4_;
  auVar182._4_4_ = fVar149 * auVar12._4_4_;
  auVar182._8_4_ = fVar149 * auVar12._8_4_;
  auVar182._12_4_ = fVar149 * auVar12._12_4_;
  fVar149 = auVar268._0_4_;
  auVar138._0_4_ = fVar149 * auVar11._0_4_;
  auVar138._4_4_ = fVar149 * auVar11._4_4_;
  auVar138._8_4_ = fVar149 * auVar11._8_4_;
  auVar138._12_4_ = fVar149 * auVar11._12_4_;
  auVar268 = vsubps_avx(auVar182,auVar138);
  auVar9 = vrcpss_avx(auVar9,auVar9);
  auVar69 = vfnmadd213ss_fma(auVar69,auVar9,SUB6416(ZEXT464(0x40000000),0));
  fVar149 = auVar69._0_4_ * auVar9._0_4_;
  auVar9 = vshufps_avx(auVar95,auVar95,0xff);
  auVar212._0_4_ = auVar9._0_4_ * fVar154;
  auVar212._4_4_ = auVar9._4_4_ * fVar173;
  auVar212._8_4_ = auVar9._8_4_ * fVar175;
  auVar212._12_4_ = auVar9._12_4_ * fVar176;
  local_498 = vsubps_avx(auVar95,auVar212);
  auVar69 = vshufps_avx(auVar201,auVar201,0xff);
  auVar158._0_4_ = auVar69._0_4_ * fVar154 + fVar61 * auVar10._0_4_ * fVar148 * auVar9._0_4_;
  auVar158._4_4_ = auVar69._4_4_ * fVar173 + fVar61 * auVar10._4_4_ * fVar148 * auVar9._4_4_;
  auVar158._8_4_ = auVar69._8_4_ * fVar175 + fVar61 * auVar10._8_4_ * fVar148 * auVar9._8_4_;
  auVar158._12_4_ = auVar69._12_4_ * fVar176 + fVar61 * auVar10._12_4_ * fVar148 * auVar9._12_4_;
  auVar10 = vsubps_avx(auVar201,auVar158);
  local_4a8._0_4_ = auVar212._0_4_ + auVar95._0_4_;
  local_4a8._4_4_ = auVar212._4_4_ + auVar95._4_4_;
  fStack_4a0 = auVar212._8_4_ + auVar95._8_4_;
  fStack_49c = auVar212._12_4_ + auVar95._12_4_;
  auVar9 = vshufps_avx(auVar73,auVar73,0xff);
  auVar96._0_4_ = fVar240 * auVar9._0_4_;
  auVar96._4_4_ = fVar251 * auVar9._4_4_;
  auVar96._8_4_ = fVar252 * auVar9._8_4_;
  auVar96._12_4_ = fVar253 * auVar9._12_4_;
  local_4b8 = vsubps_avx(auVar73,auVar96);
  auVar69 = vshufps_avx(auVar106,auVar106,0xff);
  auVar76._0_4_ = fVar240 * auVar69._0_4_ + auVar9._0_4_ * fVar132 * auVar268._0_4_ * fVar149;
  auVar76._4_4_ = fVar251 * auVar69._4_4_ + auVar9._4_4_ * fVar132 * auVar268._4_4_ * fVar149;
  auVar76._8_4_ = fVar252 * auVar69._8_4_ + auVar9._8_4_ * fVar132 * auVar268._8_4_ * fVar149;
  auVar76._12_4_ = fVar253 * auVar69._12_4_ + auVar9._12_4_ * fVar132 * auVar268._12_4_ * fVar149;
  auVar9 = vsubps_avx(auVar106,auVar76);
  local_4c8._0_4_ = auVar73._0_4_ + auVar96._0_4_;
  local_4c8._4_4_ = auVar73._4_4_ + auVar96._4_4_;
  fStack_4c0 = auVar73._8_4_ + auVar96._8_4_;
  fStack_4bc = auVar73._12_4_ + auVar96._12_4_;
  local_4d8._0_4_ = local_498._0_4_ + auVar10._0_4_ * 0.33333334;
  local_4d8._4_4_ = local_498._4_4_ + auVar10._4_4_ * 0.33333334;
  local_4d8._8_4_ = local_498._8_4_ + auVar10._8_4_ * 0.33333334;
  local_4d8._12_4_ = local_498._12_4_ + auVar10._12_4_ * 0.33333334;
  auVar77._0_4_ = auVar9._0_4_ * 0.33333334;
  auVar77._4_4_ = auVar9._4_4_ * 0.33333334;
  auVar77._8_4_ = auVar9._8_4_ * 0.33333334;
  auVar77._12_4_ = auVar9._12_4_ * 0.33333334;
  local_4e8 = vsubps_avx(local_4b8,auVar77);
  local_478 = vsubps_avx(local_498,auVar65);
  auVar9 = vshufps_avx(local_478,local_478,0x55);
  auVar69 = vshufps_avx(local_478,local_478,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar61 = pre->ray_space[k].vz.field_0.m128[0];
  fVar132 = pre->ray_space[k].vz.field_0.m128[1];
  fVar148 = pre->ray_space[k].vz.field_0.m128[2];
  fVar149 = pre->ray_space[k].vz.field_0.m128[3];
  auVar78._0_4_ = fVar61 * auVar69._0_4_;
  auVar78._4_4_ = fVar132 * auVar69._4_4_;
  auVar78._8_4_ = fVar148 * auVar69._8_4_;
  auVar78._12_4_ = fVar149 * auVar69._12_4_;
  auVar268 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar2,auVar9);
  local_488 = vsubps_avx(local_4d8,auVar65);
  auVar9 = vshufps_avx(local_488,local_488,0x55);
  auVar69 = vshufps_avx(local_488,local_488,0xaa);
  auVar79._0_4_ = fVar61 * auVar69._0_4_;
  auVar79._4_4_ = fVar132 * auVar69._4_4_;
  auVar79._8_4_ = fVar148 * auVar69._8_4_;
  auVar79._12_4_ = fVar149 * auVar69._12_4_;
  auVar69 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar2,auVar9);
  local_2f8 = vsubps_avx(local_4e8,auVar65);
  auVar9 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar242._0_4_ = fVar61 * auVar9._0_4_;
  auVar242._4_4_ = fVar132 * auVar9._4_4_;
  auVar242._8_4_ = fVar148 * auVar9._8_4_;
  auVar242._12_4_ = fVar149 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar10 = vfmadd231ps_fma(auVar242,(undefined1  [16])aVar2,auVar9);
  local_308 = vsubps_avx(local_4b8,auVar65);
  auVar9 = vshufps_avx(local_308,local_308,0xaa);
  auVar80._0_4_ = fVar61 * auVar9._0_4_;
  auVar80._4_4_ = fVar132 * auVar9._4_4_;
  auVar80._8_4_ = fVar148 * auVar9._8_4_;
  auVar80._12_4_ = fVar149 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_308,local_308,0x55);
  auVar11 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar2,auVar9);
  local_318 = vsubps_avx(_local_4a8,auVar65);
  auVar9 = vshufps_avx(local_318,local_318,0xaa);
  auVar139._0_4_ = fVar61 * auVar9._0_4_;
  auVar139._4_4_ = fVar132 * auVar9._4_4_;
  auVar139._8_4_ = fVar148 * auVar9._8_4_;
  auVar139._12_4_ = fVar149 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_318,local_318,0x55);
  auVar12 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar2,auVar9);
  local_4f8._0_4_ = (fVar150 + auVar158._0_4_) * 0.33333334 + (float)local_4a8._0_4_;
  local_4f8._4_4_ = (fVar93 + auVar158._4_4_) * 0.33333334 + (float)local_4a8._4_4_;
  fStack_4f0 = (fVar94 + auVar158._8_4_) * 0.33333334 + fStack_4a0;
  fStack_4ec = (fVar63 + auVar158._12_4_) * 0.33333334 + fStack_49c;
  local_328 = vsubps_avx(_local_4f8,auVar65);
  auVar9 = vshufps_avx(local_328,local_328,0xaa);
  auVar198._0_4_ = auVar9._0_4_ * fVar61;
  auVar198._4_4_ = auVar9._4_4_ * fVar132;
  auVar198._8_4_ = auVar9._8_4_ * fVar148;
  auVar198._12_4_ = auVar9._12_4_ * fVar149;
  auVar9 = vshufps_avx(local_328,local_328,0x55);
  auVar64 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar2,auVar9);
  auVar213._0_4_ = (fVar174 + auVar76._0_4_) * 0.33333334;
  auVar213._4_4_ = (fVar151 + auVar76._4_4_) * 0.33333334;
  auVar213._8_4_ = (fVar152 + auVar76._8_4_) * 0.33333334;
  auVar213._12_4_ = (fVar153 + auVar76._12_4_) * 0.33333334;
  _local_508 = vsubps_avx(_local_4c8,auVar213);
  local_338 = vsubps_avx(_local_508,auVar65);
  auVar9 = vshufps_avx(local_338,local_338,0xaa);
  auVar214._0_4_ = auVar9._0_4_ * fVar61;
  auVar214._4_4_ = auVar9._4_4_ * fVar132;
  auVar214._8_4_ = auVar9._8_4_ * fVar148;
  auVar214._12_4_ = auVar9._12_4_ * fVar149;
  auVar9 = vshufps_avx(local_338,local_338,0x55);
  auVar95 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar2,auVar9);
  local_348 = vsubps_avx(_local_4c8,auVar65);
  auVar9 = vshufps_avx(local_348,local_348,0xaa);
  auVar81._0_4_ = fVar61 * auVar9._0_4_;
  auVar81._4_4_ = fVar132 * auVar9._4_4_;
  auVar81._8_4_ = fVar148 * auVar9._8_4_;
  auVar81._12_4_ = fVar149 * auVar9._12_4_;
  auVar9 = vshufps_avx(local_348,local_348,0x55);
  auVar9 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar2,auVar9);
  auVar159._4_4_ = local_478._0_4_;
  auVar159._0_4_ = local_478._0_4_;
  auVar159._8_4_ = local_478._0_4_;
  auVar159._12_4_ = local_478._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar65 = vfmadd231ps_fma(auVar268,(undefined1  [16])aVar2,auVar159);
  auVar160._4_4_ = local_488._0_4_;
  auVar160._0_4_ = local_488._0_4_;
  auVar160._8_4_ = local_488._0_4_;
  auVar160._12_4_ = local_488._0_4_;
  auVar73 = vfmadd231ps_fma(auVar69,(undefined1  [16])aVar2,auVar160);
  uVar62 = local_2f8._0_4_;
  auVar161._4_4_ = uVar62;
  auVar161._0_4_ = uVar62;
  auVar161._8_4_ = uVar62;
  auVar161._12_4_ = uVar62;
  auVar201 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar2,auVar161);
  uVar62 = local_308._0_4_;
  auVar162._4_4_ = uVar62;
  auVar162._0_4_ = uVar62;
  auVar162._8_4_ = uVar62;
  auVar162._12_4_ = uVar62;
  auVar74 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar2,auVar162);
  uVar62 = local_318._0_4_;
  auVar163._4_4_ = uVar62;
  auVar163._0_4_ = uVar62;
  auVar163._8_4_ = uVar62;
  auVar163._12_4_ = uVar62;
  auVar106 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar163);
  uVar62 = local_328._0_4_;
  auVar164._4_4_ = uVar62;
  auVar164._0_4_ = uVar62;
  auVar164._8_4_ = uVar62;
  auVar164._12_4_ = uVar62;
  auVar64 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar164);
  uVar62 = local_338._0_4_;
  auVar165._4_4_ = uVar62;
  auVar165._0_4_ = uVar62;
  auVar165._8_4_ = uVar62;
  auVar165._12_4_ = uVar62;
  auVar95 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar2,auVar165);
  uVar62 = local_348._0_4_;
  auVar166._4_4_ = uVar62;
  auVar166._0_4_ = uVar62;
  auVar166._8_4_ = uVar62;
  auVar166._12_4_ = uVar62;
  auVar118 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar2,auVar166);
  auVar10 = vmovlhps_avx(auVar65,auVar106);
  auVar11 = vmovlhps_avx(auVar73,auVar64);
  auVar12 = vmovlhps_avx(auVar201,auVar95);
  _local_468 = vmovlhps_avx(auVar74,auVar118);
  auVar9 = vminps_avx(auVar10,auVar11);
  auVar69 = vminps_avx(auVar12,_local_468);
  auVar268 = vminps_avx(auVar9,auVar69);
  auVar9 = vmaxps_avx(auVar10,auVar11);
  auVar69 = vmaxps_avx(auVar12,_local_468);
  auVar9 = vmaxps_avx(auVar9,auVar69);
  auVar69 = vshufpd_avx(auVar268,auVar268,3);
  auVar268 = vminps_avx(auVar268,auVar69);
  auVar69 = vshufpd_avx(auVar9,auVar9,3);
  auVar69 = vmaxps_avx(auVar9,auVar69);
  auVar9 = vandps_avx(auVar273,auVar268);
  auVar69 = vandps_avx(auVar273,auVar69);
  auVar9 = vmaxps_avx(auVar9,auVar69);
  auVar69 = vmovshdup_avx(auVar9);
  auVar9 = vmaxss_avx(auVar69,auVar9);
  local_198 = auVar9._0_4_ * 9.536743e-07;
  local_3e8._8_8_ = auVar65._0_8_;
  local_3e8._0_8_ = auVar65._0_8_;
  local_3f8._8_8_ = auVar73._0_8_;
  local_3f8._0_8_ = auVar73._0_8_;
  local_408._0_8_ = auVar201._0_8_;
  local_408._8_8_ = local_408._0_8_;
  local_678._0_8_ = auVar74._0_8_;
  local_418._8_8_ = local_678._0_8_;
  local_418._0_8_ = local_678._0_8_;
  local_428 = auVar106._0_8_;
  register0x00001348 = local_428;
  register0x000013c8 = auVar64._0_8_;
  local_438 = auVar64._0_8_;
  register0x00001408 = auVar95._0_8_;
  local_448 = auVar95._0_8_;
  register0x00001448 = auVar118._0_8_;
  local_458 = auVar118._0_8_;
  local_2e8 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = -local_198;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1a8 = local_1b8;
  fStack_1a4 = local_1b8;
  fStack_1a0 = local_1b8;
  fStack_19c = local_1b8;
  local_3b8 = uVar51;
  uStack_3b4 = uVar51;
  uStack_3b0 = uVar51;
  uStack_3ac = uVar51;
  local_3c8 = uVar4;
  uStack_3c4 = uVar4;
  uStack_3c0 = uVar4;
  uStack_3bc = uVar4;
  uVar54 = 0;
  fVar61 = *(float *)(ray + k * 4 + 0x30);
  local_2b8 = vsubps_avx(auVar11,auVar10);
  local_2c8 = vsubps_avx(auVar12,auVar11);
  local_2d8 = vsubps_avx(_local_468,auVar12);
  local_368 = vsubps_avx(_local_4a8,local_498);
  local_378 = vsubps_avx(_local_4f8,local_4d8);
  local_388 = vsubps_avx(_local_508,local_4e8);
  _local_398 = vsubps_avx(_local_4c8,local_4b8);
  local_678 = ZEXT816(0x3f80000000000000);
  local_358 = local_678;
  do {
    auVar9 = vshufps_avx(local_678,local_678,0x50);
    auVar108._8_4_ = 0x3f800000;
    auVar108._0_8_ = &DAT_3f8000003f800000;
    auVar108._12_4_ = 0x3f800000;
    auVar114._16_4_ = 0x3f800000;
    auVar114._0_16_ = auVar108;
    auVar114._20_4_ = 0x3f800000;
    auVar114._24_4_ = 0x3f800000;
    auVar114._28_4_ = 0x3f800000;
    auVar69 = vsubps_avx(auVar108,auVar9);
    fVar132 = auVar9._0_4_;
    auVar67._0_4_ = local_428._0_4_ * fVar132;
    fVar148 = auVar9._4_4_;
    auVar67._4_4_ = local_428._4_4_ * fVar148;
    fVar149 = auVar9._8_4_;
    auVar67._8_4_ = local_428._8_4_ * fVar149;
    fVar150 = auVar9._12_4_;
    auVar67._12_4_ = local_428._12_4_ * fVar150;
    auVar140._0_4_ = local_438._0_4_ * fVar132;
    auVar140._4_4_ = local_438._4_4_ * fVar148;
    auVar140._8_4_ = local_438._8_4_ * fVar149;
    auVar140._12_4_ = local_438._12_4_ * fVar150;
    auVar183._0_4_ = local_448._0_4_ * fVar132;
    auVar183._4_4_ = local_448._4_4_ * fVar148;
    auVar183._8_4_ = local_448._8_4_ * fVar149;
    auVar183._12_4_ = local_448._12_4_ * fVar150;
    auVar267._0_4_ = local_458._0_4_ * fVar132;
    auVar267._4_4_ = local_458._4_4_ * fVar148;
    auVar267._8_4_ = local_458._8_4_ * fVar149;
    auVar267._12_4_ = local_458._12_4_ * fVar150;
    auVar64 = vfmadd231ps_fma(auVar67,auVar69,local_3e8);
    auVar95 = vfmadd231ps_fma(auVar140,auVar69,local_3f8);
    auVar73 = vfmadd231ps_fma(auVar183,auVar69,local_408);
    auVar201 = vfmadd231ps_fma(auVar267,local_418,auVar69);
    local_618 = auVar201._0_4_;
    auVar9 = vmovshdup_avx(local_358);
    fVar132 = local_358._0_4_;
    fVar93 = (auVar9._0_4_ - fVar132) * 0.04761905;
    auVar209._4_4_ = fVar132;
    auVar209._0_4_ = fVar132;
    auVar209._8_4_ = fVar132;
    auVar209._12_4_ = fVar132;
    auVar209._16_4_ = fVar132;
    auVar209._20_4_ = fVar132;
    auVar209._24_4_ = fVar132;
    auVar209._28_4_ = fVar132;
    auVar103._0_8_ = auVar9._0_8_;
    auVar103._8_8_ = auVar103._0_8_;
    auVar103._16_8_ = auVar103._0_8_;
    auVar103._24_8_ = auVar103._0_8_;
    auVar71 = vsubps_avx(auVar103,auVar209);
    uVar62 = auVar64._0_4_;
    auVar277._4_4_ = uVar62;
    auVar277._0_4_ = uVar62;
    auVar277._8_4_ = uVar62;
    auVar277._12_4_ = uVar62;
    auVar277._16_4_ = uVar62;
    auVar277._20_4_ = uVar62;
    auVar277._24_4_ = uVar62;
    auVar277._28_4_ = uVar62;
    auVar9 = vmovshdup_avx(auVar64);
    uVar155 = auVar9._0_8_;
    auVar262._8_8_ = uVar155;
    auVar262._0_8_ = uVar155;
    auVar262._16_8_ = uVar155;
    auVar262._24_8_ = uVar155;
    fVar94 = auVar95._0_4_;
    auVar90._4_4_ = fVar94;
    auVar90._0_4_ = fVar94;
    auVar90._8_4_ = fVar94;
    auVar90._12_4_ = fVar94;
    auVar90._16_4_ = fVar94;
    auVar90._20_4_ = fVar94;
    auVar90._24_4_ = fVar94;
    auVar90._28_4_ = fVar94;
    auVar69 = vmovshdup_avx(auVar95);
    auVar170._0_8_ = auVar69._0_8_;
    auVar170._8_8_ = auVar170._0_8_;
    auVar170._16_8_ = auVar170._0_8_;
    auVar170._24_8_ = auVar170._0_8_;
    fVar151 = auVar73._0_4_;
    auVar239._4_4_ = fVar151;
    auVar239._0_4_ = fVar151;
    auVar239._8_4_ = fVar151;
    auVar239._12_4_ = fVar151;
    auVar239._16_4_ = fVar151;
    auVar239._20_4_ = fVar151;
    auVar239._24_4_ = fVar151;
    auVar239._28_4_ = fVar151;
    auVar268 = vmovshdup_avx(auVar73);
    auVar219._0_8_ = auVar268._0_8_;
    auVar219._8_8_ = auVar219._0_8_;
    auVar219._16_8_ = auVar219._0_8_;
    auVar219._24_8_ = auVar219._0_8_;
    auVar65 = vmovshdup_avx(auVar201);
    auVar74 = vfmadd132ps_fma(auVar71,auVar209,_DAT_02020f20);
    auVar71 = vsubps_avx(auVar114,ZEXT1632(auVar74));
    fVar132 = auVar74._0_4_;
    auVar270._0_4_ = fVar94 * fVar132;
    fVar148 = auVar74._4_4_;
    auVar270._4_4_ = fVar94 * fVar148;
    fVar149 = auVar74._8_4_;
    auVar270._8_4_ = fVar94 * fVar149;
    fVar150 = auVar74._12_4_;
    auVar270._12_4_ = fVar94 * fVar150;
    auVar270._16_4_ = fVar94 * 0.0;
    auVar270._20_4_ = fVar94 * 0.0;
    auVar270._24_4_ = fVar94 * 0.0;
    auVar270._28_4_ = 0;
    auVar74 = vfmadd231ps_fma(auVar270,auVar71,auVar277);
    fVar63 = auVar69._0_4_;
    auVar248._0_4_ = fVar63 * fVar132;
    fVar174 = auVar69._4_4_;
    auVar248._4_4_ = fVar174 * fVar148;
    auVar248._8_4_ = fVar63 * fVar149;
    auVar248._12_4_ = fVar174 * fVar150;
    auVar248._16_4_ = fVar63 * 0.0;
    auVar248._20_4_ = fVar174 * 0.0;
    auVar248._24_4_ = fVar63 * 0.0;
    auVar248._28_4_ = 0;
    auVar106 = vfmadd231ps_fma(auVar248,auVar71,auVar262);
    auVar13._4_4_ = fVar151 * fVar148;
    auVar13._0_4_ = fVar151 * fVar132;
    auVar13._8_4_ = fVar151 * fVar149;
    auVar13._12_4_ = fVar151 * fVar150;
    auVar13._16_4_ = fVar151 * 0.0;
    auVar13._20_4_ = fVar151 * 0.0;
    auVar13._24_4_ = fVar151 * 0.0;
    auVar13._28_4_ = auVar9._4_4_;
    auVar118 = vfmadd231ps_fma(auVar13,auVar71,auVar90);
    fVar63 = auVar268._0_4_;
    fVar174 = auVar268._4_4_;
    auVar14._4_4_ = fVar174 * fVar148;
    auVar14._0_4_ = fVar63 * fVar132;
    auVar14._8_4_ = fVar63 * fVar149;
    auVar14._12_4_ = fVar174 * fVar150;
    auVar14._16_4_ = fVar63 * 0.0;
    auVar14._20_4_ = fVar174 * 0.0;
    auVar14._24_4_ = fVar63 * 0.0;
    auVar14._28_4_ = uVar62;
    auVar122 = vfmadd231ps_fma(auVar14,auVar71,auVar170);
    auVar9 = vshufps_avx(auVar64,auVar64,0xaa);
    auVar171._0_8_ = auVar9._0_8_;
    auVar171._8_8_ = auVar171._0_8_;
    auVar171._16_8_ = auVar171._0_8_;
    auVar171._24_8_ = auVar171._0_8_;
    auVar69 = vshufps_avx(auVar64,auVar64,0xff);
    uStack_5b0 = auVar69._0_8_;
    local_5b8 = (undefined1  [8])uStack_5b0;
    uStack_5a8 = uStack_5b0;
    uStack_5a0 = uStack_5b0;
    auVar15._4_4_ = fVar148 * local_618;
    auVar15._0_4_ = fVar132 * local_618;
    auVar15._8_4_ = fVar149 * local_618;
    auVar15._12_4_ = fVar150 * local_618;
    auVar15._16_4_ = local_618 * 0.0;
    auVar15._20_4_ = local_618 * 0.0;
    auVar15._24_4_ = local_618 * 0.0;
    auVar15._28_4_ = 0x3f800000;
    auVar72 = vfmadd231ps_fma(auVar15,auVar71,auVar239);
    auVar268 = vshufps_avx(auVar95,auVar95,0xaa);
    auVar130._0_8_ = auVar268._0_8_;
    auVar130._8_8_ = auVar130._0_8_;
    auVar130._16_8_ = auVar130._0_8_;
    auVar130._24_8_ = auVar130._0_8_;
    auVar64 = vshufps_avx(auVar95,auVar95,0xff);
    auVar147._0_8_ = auVar64._0_8_;
    auVar147._8_8_ = auVar147._0_8_;
    auVar147._16_8_ = auVar147._0_8_;
    auVar147._24_8_ = auVar147._0_8_;
    fVar63 = auVar65._0_4_;
    fVar174 = auVar65._4_4_;
    auVar16._4_4_ = fVar174 * fVar148;
    auVar16._0_4_ = fVar63 * fVar132;
    auVar16._8_4_ = fVar63 * fVar149;
    auVar16._12_4_ = fVar174 * fVar150;
    auVar16._16_4_ = fVar63 * 0.0;
    auVar16._20_4_ = fVar174 * 0.0;
    auVar16._24_4_ = fVar63 * 0.0;
    auVar16._28_4_ = fVar151;
    auVar117 = vfmadd231ps_fma(auVar16,auVar71,auVar219);
    auVar17._28_4_ = fVar94;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar150,
                            CONCAT48(auVar118._8_4_ * fVar149,
                                     CONCAT44(auVar118._4_4_ * fVar148,auVar118._0_4_ * fVar132))));
    auVar74 = vfmadd231ps_fma(auVar17,auVar71,ZEXT1632(auVar74));
    auVar18._28_4_ = auVar69._4_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar122._12_4_ * fVar150,
                            CONCAT48(auVar122._8_4_ * fVar149,
                                     CONCAT44(auVar122._4_4_ * fVar148,auVar122._0_4_ * fVar132))));
    auVar106 = vfmadd231ps_fma(auVar18,auVar71,ZEXT1632(auVar106));
    auVar69 = vshufps_avx(auVar73,auVar73,0xaa);
    uVar155 = auVar69._0_8_;
    auVar249._8_8_ = uVar155;
    auVar249._0_8_ = uVar155;
    auVar249._16_8_ = uVar155;
    auVar249._24_8_ = uVar155;
    auVar65 = vshufps_avx(auVar73,auVar73,0xff);
    uVar155 = auVar65._0_8_;
    auVar271._8_8_ = uVar155;
    auVar271._0_8_ = uVar155;
    auVar271._16_8_ = uVar155;
    auVar271._24_8_ = uVar155;
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar72._12_4_,
                                                  CONCAT48(fVar149 * auVar72._8_4_,
                                                           CONCAT44(fVar148 * auVar72._4_4_,
                                                                    fVar132 * auVar72._0_4_)))),
                               auVar71,ZEXT1632(auVar118));
    auVar95 = vshufps_avx(auVar201,auVar201,0xaa);
    auVar73 = vshufps_avx(auVar201,auVar201,0xff);
    local_618 = auVar73._0_4_;
    fStack_614 = auVar73._4_4_;
    auVar19._28_4_ = fStack_614;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar117._12_4_ * fVar150,
                            CONCAT48(auVar117._8_4_ * fVar149,
                                     CONCAT44(auVar117._4_4_ * fVar148,auVar117._0_4_ * fVar132))));
    auVar73 = vfmadd231ps_fma(auVar19,auVar71,ZEXT1632(auVar122));
    auVar201 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar118._12_4_,
                                                  CONCAT48(fVar149 * auVar118._8_4_,
                                                           CONCAT44(fVar148 * auVar118._4_4_,
                                                                    fVar132 * auVar118._0_4_)))),
                               auVar71,ZEXT1632(auVar74));
    auVar13 = vsubps_avx(ZEXT1632(auVar118),ZEXT1632(auVar74));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar73._12_4_,
                                                 CONCAT48(fVar149 * auVar73._8_4_,
                                                          CONCAT44(fVar148 * auVar73._4_4_,
                                                                   fVar132 * auVar73._0_4_)))),
                              auVar71,ZEXT1632(auVar106));
    auVar14 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar106));
    fVar154 = fVar93 * auVar13._0_4_ * 3.0;
    fVar175 = fVar93 * auVar13._4_4_ * 3.0;
    auVar250._4_4_ = fVar175;
    auVar250._0_4_ = fVar154;
    fVar240 = fVar93 * auVar13._8_4_ * 3.0;
    auVar250._8_4_ = fVar240;
    fVar252 = fVar93 * auVar13._12_4_ * 3.0;
    auVar250._12_4_ = fVar252;
    fVar229 = fVar93 * auVar13._16_4_ * 3.0;
    auVar250._16_4_ = fVar229;
    fVar230 = fVar93 * auVar13._20_4_ * 3.0;
    auVar250._20_4_ = fVar230;
    fVar231 = fVar93 * auVar13._24_4_ * 3.0;
    auVar250._24_4_ = fVar231;
    auVar250._28_4_ = 0x40400000;
    local_598._0_4_ = fVar93 * auVar14._0_4_ * 3.0;
    local_598._4_4_ = fVar93 * auVar14._4_4_ * 3.0;
    fStack_590 = fVar93 * auVar14._8_4_ * 3.0;
    fStack_58c = fVar93 * auVar14._12_4_ * 3.0;
    fStack_588 = fVar93 * auVar14._16_4_ * 3.0;
    fStack_584 = fVar93 * auVar14._20_4_ * 3.0;
    fStack_580 = fVar93 * auVar14._24_4_ * 3.0;
    fStack_57c = auVar14._28_4_;
    fVar94 = auVar268._0_4_;
    fVar63 = auVar268._4_4_;
    auVar21._4_4_ = fVar63 * fVar148;
    auVar21._0_4_ = fVar94 * fVar132;
    auVar21._8_4_ = fVar94 * fVar149;
    auVar21._12_4_ = fVar63 * fVar150;
    auVar21._16_4_ = fVar94 * 0.0;
    auVar21._20_4_ = fVar63 * 0.0;
    auVar21._24_4_ = fVar94 * 0.0;
    auVar21._28_4_ = auVar13._28_4_;
    auVar268 = vfmadd231ps_fma(auVar21,auVar71,auVar171);
    fVar94 = auVar64._0_4_;
    fVar174 = auVar64._4_4_;
    auVar22._4_4_ = fVar174 * fVar148;
    auVar22._0_4_ = fVar94 * fVar132;
    auVar22._8_4_ = fVar94 * fVar149;
    auVar22._12_4_ = fVar174 * fVar150;
    auVar22._16_4_ = fVar94 * 0.0;
    auVar22._20_4_ = fVar174 * 0.0;
    auVar22._24_4_ = fVar94 * 0.0;
    auVar22._28_4_ = auVar9._4_4_;
    auVar9 = vfmadd231ps_fma(auVar22,auVar71,_local_5b8);
    fVar94 = auVar69._0_4_;
    fVar174 = auVar69._4_4_;
    auVar23._4_4_ = fVar174 * fVar148;
    auVar23._0_4_ = fVar94 * fVar132;
    auVar23._8_4_ = fVar94 * fVar149;
    auVar23._12_4_ = fVar174 * fVar150;
    auVar23._16_4_ = fVar94 * 0.0;
    auVar23._20_4_ = fVar174 * 0.0;
    auVar23._24_4_ = fVar94 * 0.0;
    auVar23._28_4_ = fVar93;
    auVar69 = vfmadd231ps_fma(auVar23,auVar71,auVar130);
    fVar94 = auVar65._0_4_;
    fVar151 = auVar65._4_4_;
    auVar24._4_4_ = fVar151 * fVar148;
    auVar24._0_4_ = fVar94 * fVar132;
    auVar24._8_4_ = fVar94 * fVar149;
    auVar24._12_4_ = fVar151 * fVar150;
    auVar24._16_4_ = fVar94 * 0.0;
    auVar24._20_4_ = fVar151 * 0.0;
    auVar24._24_4_ = fVar94 * 0.0;
    auVar24._28_4_ = fVar63;
    auVar65 = vfmadd231ps_fma(auVar24,auVar71,auVar147);
    local_2a8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar201));
    fVar94 = auVar95._0_4_;
    fVar63 = auVar95._4_4_;
    auVar25._4_4_ = fVar63 * fVar148;
    auVar25._0_4_ = fVar94 * fVar132;
    auVar25._8_4_ = fVar94 * fVar149;
    auVar25._12_4_ = fVar63 * fVar150;
    auVar25._16_4_ = fVar94 * 0.0;
    auVar25._20_4_ = fVar63 * 0.0;
    auVar25._24_4_ = fVar94 * 0.0;
    auVar25._28_4_ = local_2a8._28_4_;
    auVar64 = vfmadd231ps_fma(auVar25,auVar71,auVar249);
    auVar17 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar74));
    auVar26._4_4_ = fVar148 * fStack_614;
    auVar26._0_4_ = fVar132 * local_618;
    auVar26._8_4_ = fVar149 * local_618;
    auVar26._12_4_ = fVar150 * fStack_614;
    auVar26._16_4_ = local_618 * 0.0;
    auVar26._20_4_ = fStack_614 * 0.0;
    auVar26._24_4_ = local_618 * 0.0;
    auVar26._28_4_ = fVar174;
    auVar95 = vfmadd231ps_fma(auVar26,auVar71,auVar271);
    auVar27._28_4_ = fVar63;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar150 * auVar69._12_4_,
                            CONCAT48(fVar149 * auVar69._8_4_,
                                     CONCAT44(fVar148 * auVar69._4_4_,fVar132 * auVar69._0_4_))));
    auVar268 = vfmadd231ps_fma(auVar27,auVar71,ZEXT1632(auVar268));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar65._12_4_,
                                                CONCAT48(fVar149 * auVar65._8_4_,
                                                         CONCAT44(fVar148 * auVar65._4_4_,
                                                                  fVar132 * auVar65._0_4_)))),
                             auVar71,ZEXT1632(auVar9));
    fVar154 = auVar201._0_4_ + fVar154;
    fVar175 = auVar201._4_4_ + fVar175;
    fVar240 = auVar201._8_4_ + fVar240;
    fVar252 = auVar201._12_4_ + fVar252;
    fVar229 = fVar229 + 0.0;
    fVar230 = fVar230 + 0.0;
    fVar231 = fVar231 + 0.0;
    auVar28._28_4_ = 0x40400000;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar95._12_4_ * fVar150,
                            CONCAT48(auVar95._8_4_ * fVar149,
                                     CONCAT44(auVar95._4_4_ * fVar148,auVar95._0_4_ * fVar132))));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar64._12_4_,
                                                 CONCAT48(fVar149 * auVar64._8_4_,
                                                          CONCAT44(fVar148 * auVar64._4_4_,
                                                                   fVar132 * auVar64._0_4_)))),
                              auVar71,ZEXT1632(auVar69));
    auVar65 = vfmadd231ps_fma(auVar28,auVar71,ZEXT1632(auVar65));
    auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar69._12_4_,
                                                 CONCAT48(fVar149 * auVar69._8_4_,
                                                          CONCAT44(fVar148 * auVar69._4_4_,
                                                                   fVar132 * auVar69._0_4_)))),
                              auVar71,ZEXT1632(auVar268));
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar150 * auVar65._12_4_,
                                                 CONCAT48(fVar149 * auVar65._8_4_,
                                                          CONCAT44(fVar148 * auVar65._4_4_,
                                                                   fVar132 * auVar65._0_4_)))),
                              ZEXT1632(auVar9),auVar71);
    auVar71 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar268));
    auVar13 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar9));
    fVar132 = fVar93 * auVar71._0_4_ * 3.0;
    fVar148 = fVar93 * auVar71._4_4_ * 3.0;
    auVar29._4_4_ = fVar148;
    auVar29._0_4_ = fVar132;
    fVar149 = fVar93 * auVar71._8_4_ * 3.0;
    auVar29._8_4_ = fVar149;
    fVar150 = fVar93 * auVar71._12_4_ * 3.0;
    auVar29._12_4_ = fVar150;
    fVar151 = fVar93 * auVar71._16_4_ * 3.0;
    auVar29._16_4_ = fVar151;
    fVar152 = fVar93 * auVar71._20_4_ * 3.0;
    auVar29._20_4_ = fVar152;
    fVar153 = fVar93 * auVar71._24_4_ * 3.0;
    auVar29._24_4_ = fVar153;
    auVar29._28_4_ = 0x40400000;
    auVar193._0_4_ = fVar93 * auVar13._0_4_ * 3.0;
    auVar193._4_4_ = fVar93 * auVar13._4_4_ * 3.0;
    auVar193._8_4_ = fVar93 * auVar13._8_4_ * 3.0;
    auVar193._12_4_ = fVar93 * auVar13._12_4_ * 3.0;
    auVar193._16_4_ = fVar93 * auVar13._16_4_ * 3.0;
    auVar193._20_4_ = fVar93 * auVar13._20_4_ * 3.0;
    auVar193._24_4_ = fVar93 * auVar13._24_4_ * 3.0;
    auVar193._28_4_ = 0;
    auVar18 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar64));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar95));
    auVar71 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar201));
    auVar13 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar74));
    auVar15 = vsubps_avx(auVar18,local_2a8);
    fVar173 = auVar71._0_4_ + auVar15._0_4_;
    fVar176 = auVar71._4_4_ + auVar15._4_4_;
    fVar251 = auVar71._8_4_ + auVar15._8_4_;
    fVar253 = auVar71._12_4_ + auVar15._12_4_;
    fVar177 = auVar71._16_4_ + auVar15._16_4_;
    fVar178 = auVar71._20_4_ + auVar15._20_4_;
    fVar179 = auVar71._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(local_78,auVar17);
    auVar263._0_4_ = auVar13._0_4_ + auVar16._0_4_;
    auVar263._4_4_ = auVar13._4_4_ + auVar16._4_4_;
    auVar263._8_4_ = auVar13._8_4_ + auVar16._8_4_;
    auVar263._12_4_ = auVar13._12_4_ + auVar16._12_4_;
    auVar263._16_4_ = auVar13._16_4_ + auVar16._16_4_;
    auVar263._20_4_ = auVar13._20_4_ + auVar16._20_4_;
    auVar263._24_4_ = auVar13._24_4_ + auVar16._24_4_;
    auVar263._28_4_ = auVar13._28_4_ + auVar16._28_4_;
    fVar93 = auVar74._0_4_;
    local_158 = fVar93 + (float)local_598._0_4_;
    fVar94 = auVar74._4_4_;
    fStack_154 = fVar94 + (float)local_598._4_4_;
    fVar63 = auVar74._8_4_;
    fStack_150 = fVar63 + fStack_590;
    fVar174 = auVar74._12_4_;
    fStack_14c = fVar174 + fStack_58c;
    fStack_148 = fStack_588 + 0.0;
    fStack_144 = fStack_584 + 0.0;
    fStack_140 = fStack_580 + 0.0;
    fStack_13c = auVar14._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar201);
    auVar13 = vsubps_avx(local_98,auVar250);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_b8 = ZEXT1632(auVar74);
    auVar13 = vsubps_avx(local_b8,_local_598);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    local_f8._0_4_ = auVar64._0_4_ + fVar132;
    local_f8._4_4_ = auVar64._4_4_ + fVar148;
    local_f8._8_4_ = auVar64._8_4_ + fVar149;
    local_f8._12_4_ = auVar64._12_4_ + fVar150;
    local_f8._16_4_ = fVar151 + 0.0;
    local_f8._20_4_ = fVar152 + 0.0;
    local_f8._24_4_ = fVar153 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar250 = ZEXT1632(auVar64);
    auVar13 = vsubps_avx(auVar250,auVar29);
    auVar19 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    fVar132 = auVar95._0_4_;
    local_138._0_4_ = fVar132 + auVar193._0_4_;
    fVar148 = auVar95._4_4_;
    local_138._4_4_ = fVar148 + auVar193._4_4_;
    fVar149 = auVar95._8_4_;
    local_138._8_4_ = fVar149 + auVar193._8_4_;
    fVar150 = auVar95._12_4_;
    local_138._12_4_ = fVar150 + auVar193._12_4_;
    local_138._16_4_ = auVar193._16_4_ + 0.0;
    local_138._20_4_ = auVar193._20_4_ + 0.0;
    local_138._24_4_ = auVar193._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar13 = vsubps_avx(ZEXT1632(auVar95),auVar193);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar13);
    auVar30._4_4_ = fVar94 * fVar176;
    auVar30._0_4_ = fVar93 * fVar173;
    auVar30._8_4_ = fVar63 * fVar251;
    auVar30._12_4_ = fVar174 * fVar253;
    auVar30._16_4_ = fVar177 * 0.0;
    auVar30._20_4_ = fVar178 * 0.0;
    auVar30._24_4_ = fVar179 * 0.0;
    auVar30._28_4_ = auVar13._28_4_;
    auVar9 = vfnmadd231ps_fma(auVar30,local_98,auVar263);
    auVar31._4_4_ = fStack_154 * fVar176;
    auVar31._0_4_ = local_158 * fVar173;
    auVar31._8_4_ = fStack_150 * fVar251;
    auVar31._12_4_ = fStack_14c * fVar253;
    auVar31._16_4_ = fStack_148 * fVar177;
    auVar31._20_4_ = fStack_144 * fVar178;
    auVar31._24_4_ = fStack_140 * fVar179;
    auVar31._28_4_ = auVar19._28_4_;
    auVar44._4_4_ = fVar175;
    auVar44._0_4_ = fVar154;
    auVar44._8_4_ = fVar240;
    auVar44._12_4_ = fVar252;
    auVar44._16_4_ = fVar229;
    auVar44._20_4_ = fVar230;
    auVar44._24_4_ = fVar231;
    auVar44._28_4_ = 0x40400000;
    auVar69 = vfnmadd231ps_fma(auVar31,auVar263,auVar44);
    auVar32._4_4_ = local_178._4_4_ * fVar176;
    auVar32._0_4_ = local_178._0_4_ * fVar173;
    auVar32._8_4_ = local_178._8_4_ * fVar251;
    auVar32._12_4_ = local_178._12_4_ * fVar253;
    auVar32._16_4_ = local_178._16_4_ * fVar177;
    auVar32._20_4_ = local_178._20_4_ * fVar178;
    auVar32._24_4_ = local_178._24_4_ * fVar179;
    auVar32._28_4_ = fStack_13c;
    auVar268 = vfnmadd231ps_fma(auVar32,local_d8,auVar263);
    local_5b8._0_4_ = auVar17._0_4_;
    local_5b8._4_4_ = auVar17._4_4_;
    uStack_5b0._0_4_ = auVar17._8_4_;
    uStack_5b0._4_4_ = auVar17._12_4_;
    uStack_5a8._0_4_ = auVar17._16_4_;
    uStack_5a8._4_4_ = auVar17._20_4_;
    uStack_5a0._0_4_ = auVar17._24_4_;
    auVar33._4_4_ = fVar176 * (float)local_5b8._4_4_;
    auVar33._0_4_ = fVar173 * (float)local_5b8._0_4_;
    auVar33._8_4_ = fVar251 * (float)uStack_5b0;
    auVar33._12_4_ = fVar253 * uStack_5b0._4_4_;
    auVar33._16_4_ = fVar177 * (float)uStack_5a8;
    auVar33._20_4_ = fVar178 * uStack_5a8._4_4_;
    auVar33._24_4_ = fVar179 * (float)uStack_5a0;
    auVar33._28_4_ = local_178._28_4_;
    auVar65 = vfnmadd231ps_fma(auVar33,local_2a8,auVar263);
    auVar50._4_4_ = fVar148 * fVar176;
    auVar50._0_4_ = fVar132 * fVar173;
    auVar50._8_4_ = fVar149 * fVar251;
    auVar50._12_4_ = fVar150 * fVar253;
    auVar50._16_4_ = fVar177 * 0.0;
    auVar50._20_4_ = fVar178 * 0.0;
    auVar50._24_4_ = fVar179 * 0.0;
    auVar50._28_4_ = DAT_0205d4a0._28_4_;
    auVar64 = vfnmadd231ps_fma(auVar50,auVar250,auVar263);
    auVar34._4_4_ = local_138._4_4_ * fVar176;
    auVar34._0_4_ = local_138._0_4_ * fVar173;
    auVar34._8_4_ = local_138._8_4_ * fVar251;
    auVar34._12_4_ = local_138._12_4_ * fVar253;
    auVar34._16_4_ = local_138._16_4_ * fVar177;
    auVar34._20_4_ = local_138._20_4_ * fVar178;
    auVar34._24_4_ = local_138._24_4_ * fVar179;
    auVar34._28_4_ = local_2a8._28_4_;
    auVar73 = vfnmadd231ps_fma(auVar34,local_f8,auVar263);
    auVar35._4_4_ = local_118._4_4_ * fVar176;
    auVar35._0_4_ = local_118._0_4_ * fVar173;
    auVar35._8_4_ = local_118._8_4_ * fVar251;
    auVar35._12_4_ = local_118._12_4_ * fVar253;
    auVar35._16_4_ = local_118._16_4_ * fVar177;
    auVar35._20_4_ = local_118._20_4_ * fVar178;
    auVar35._24_4_ = local_118._24_4_ * fVar179;
    auVar35._28_4_ = local_d8._28_4_;
    auVar201 = vfnmadd231ps_fma(auVar35,auVar263,auVar19);
    auVar36._4_4_ = local_78._4_4_ * fVar176;
    auVar36._0_4_ = local_78._0_4_ * fVar173;
    auVar36._8_4_ = local_78._8_4_ * fVar251;
    auVar36._12_4_ = local_78._12_4_ * fVar253;
    auVar36._16_4_ = local_78._16_4_ * fVar177;
    auVar36._20_4_ = local_78._20_4_ * fVar178;
    auVar36._24_4_ = local_78._24_4_ * fVar179;
    auVar36._28_4_ = auVar71._28_4_ + auVar15._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar36,auVar263,auVar18);
    auVar13 = vminps_avx(ZEXT1632(auVar9),ZEXT1632(auVar69));
    auVar71 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar69));
    auVar14 = vminps_avx(ZEXT1632(auVar268),ZEXT1632(auVar65));
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar268),ZEXT1632(auVar65));
    auVar71 = vmaxps_avx(auVar71,auVar13);
    auVar15 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar73));
    auVar13 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar73));
    auVar16 = vminps_avx(ZEXT1632(auVar201),ZEXT1632(auVar74));
    auVar15 = vminps_avx(auVar15,auVar16);
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar201),ZEXT1632(auVar74));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(auVar71,auVar13);
    auVar49._4_4_ = fStack_194;
    auVar49._0_4_ = local_198;
    auVar49._8_4_ = fStack_190;
    auVar49._12_4_ = fStack_18c;
    auVar49._16_4_ = fStack_188;
    auVar49._20_4_ = fStack_184;
    auVar49._24_4_ = fStack_180;
    auVar49._28_4_ = fStack_17c;
    auVar71 = vcmpps_avx(auVar15,auVar49,2);
    auVar48._4_4_ = fStack_1b4;
    auVar48._0_4_ = local_1b8;
    auVar48._8_4_ = fStack_1b0;
    auVar48._12_4_ = fStack_1ac;
    auVar48._16_4_ = fStack_1a8;
    auVar48._20_4_ = fStack_1a4;
    auVar48._24_4_ = fStack_1a0;
    auVar48._28_4_ = fStack_19c;
    auVar13 = vcmpps_avx(auVar13,auVar48,5);
    auVar71 = vandps_avx(auVar13,auVar71);
    auVar13 = local_288 & auVar71;
    uVar52 = 0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0x7f,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0xbf,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0')
    {
      auVar13 = vsubps_avx(local_2a8,local_98);
      auVar14 = vsubps_avx(auVar18,auVar250);
      fVar152 = auVar13._0_4_ + auVar14._0_4_;
      fVar153 = auVar13._4_4_ + auVar14._4_4_;
      fVar173 = auVar13._8_4_ + auVar14._8_4_;
      fVar176 = auVar13._12_4_ + auVar14._12_4_;
      fVar251 = auVar13._16_4_ + auVar14._16_4_;
      fVar253 = auVar13._20_4_ + auVar14._20_4_;
      fVar177 = auVar13._24_4_ + auVar14._24_4_;
      auVar15 = vsubps_avx(auVar17,local_b8);
      auVar16 = vsubps_avx(local_78,ZEXT1632(auVar95));
      auVar91._0_4_ = auVar15._0_4_ + auVar16._0_4_;
      auVar91._4_4_ = auVar15._4_4_ + auVar16._4_4_;
      auVar91._8_4_ = auVar15._8_4_ + auVar16._8_4_;
      auVar91._12_4_ = auVar15._12_4_ + auVar16._12_4_;
      auVar91._16_4_ = auVar15._16_4_ + auVar16._16_4_;
      auVar91._20_4_ = auVar15._20_4_ + auVar16._20_4_;
      auVar91._24_4_ = auVar15._24_4_ + auVar16._24_4_;
      fVar151 = auVar16._28_4_;
      auVar91._28_4_ = auVar15._28_4_ + fVar151;
      auVar272._0_4_ = fVar93 * fVar152;
      auVar272._4_4_ = fVar94 * fVar153;
      auVar272._8_4_ = fVar63 * fVar173;
      auVar272._12_4_ = fVar174 * fVar176;
      auVar272._16_4_ = fVar251 * 0.0;
      auVar272._20_4_ = fVar253 * 0.0;
      auVar272._24_4_ = fVar177 * 0.0;
      auVar272._28_4_ = 0;
      auVar64 = vfnmadd231ps_fma(auVar272,auVar91,local_98);
      auVar37._4_4_ = fVar153 * fStack_154;
      auVar37._0_4_ = fVar152 * local_158;
      auVar37._8_4_ = fVar173 * fStack_150;
      auVar37._12_4_ = fVar176 * fStack_14c;
      auVar37._16_4_ = fVar251 * fStack_148;
      auVar37._20_4_ = fVar253 * fStack_144;
      auVar37._24_4_ = fVar177 * fStack_140;
      auVar37._28_4_ = fVar151;
      auVar45._4_4_ = fVar175;
      auVar45._0_4_ = fVar154;
      auVar45._8_4_ = fVar240;
      auVar45._12_4_ = fVar252;
      auVar45._16_4_ = fVar229;
      auVar45._20_4_ = fVar230;
      auVar45._24_4_ = fVar231;
      auVar45._28_4_ = 0x40400000;
      auVar9 = vfnmadd213ps_fma(auVar45,auVar91,auVar37);
      auVar38._4_4_ = fVar153 * local_178._4_4_;
      auVar38._0_4_ = fVar152 * local_178._0_4_;
      auVar38._8_4_ = fVar173 * local_178._8_4_;
      auVar38._12_4_ = fVar176 * local_178._12_4_;
      auVar38._16_4_ = fVar251 * local_178._16_4_;
      auVar38._20_4_ = fVar253 * local_178._20_4_;
      auVar38._24_4_ = fVar177 * local_178._24_4_;
      auVar38._28_4_ = fVar151;
      auVar69 = vfnmadd213ps_fma(local_d8,auVar91,auVar38);
      auVar39._4_4_ = (float)local_5b8._4_4_ * fVar153;
      auVar39._0_4_ = (float)local_5b8._0_4_ * fVar152;
      auVar39._8_4_ = (float)uStack_5b0 * fVar173;
      auVar39._12_4_ = uStack_5b0._4_4_ * fVar176;
      auVar39._16_4_ = (float)uStack_5a8 * fVar251;
      auVar39._20_4_ = uStack_5a8._4_4_ * fVar253;
      auVar39._24_4_ = (float)uStack_5a0 * fVar177;
      auVar39._28_4_ = fVar151;
      auVar95 = vfnmadd231ps_fma(auVar39,auVar91,local_2a8);
      auVar104._0_4_ = fVar132 * fVar152;
      auVar104._4_4_ = fVar148 * fVar153;
      auVar104._8_4_ = fVar149 * fVar173;
      auVar104._12_4_ = fVar150 * fVar176;
      auVar104._16_4_ = fVar251 * 0.0;
      auVar104._20_4_ = fVar253 * 0.0;
      auVar104._24_4_ = fVar177 * 0.0;
      auVar104._28_4_ = 0;
      auVar73 = vfnmadd231ps_fma(auVar104,auVar91,auVar250);
      auVar40._4_4_ = fVar153 * local_138._4_4_;
      auVar40._0_4_ = fVar152 * local_138._0_4_;
      auVar40._8_4_ = fVar173 * local_138._8_4_;
      auVar40._12_4_ = fVar176 * local_138._12_4_;
      auVar40._16_4_ = fVar251 * local_138._16_4_;
      auVar40._20_4_ = fVar253 * local_138._20_4_;
      auVar40._24_4_ = fVar177 * local_138._24_4_;
      auVar40._28_4_ = auVar17._28_4_;
      auVar268 = vfnmadd213ps_fma(local_f8,auVar91,auVar40);
      auVar41._4_4_ = fVar153 * local_118._4_4_;
      auVar41._0_4_ = fVar152 * local_118._0_4_;
      auVar41._8_4_ = fVar173 * local_118._8_4_;
      auVar41._12_4_ = fVar176 * local_118._12_4_;
      auVar41._16_4_ = fVar251 * local_118._16_4_;
      auVar41._20_4_ = fVar253 * local_118._20_4_;
      auVar41._24_4_ = fVar177 * local_118._24_4_;
      auVar41._28_4_ = auVar17._28_4_;
      auVar65 = vfnmadd213ps_fma(auVar19,auVar91,auVar41);
      auVar42._4_4_ = local_78._4_4_ * fVar153;
      auVar42._0_4_ = local_78._0_4_ * fVar152;
      auVar42._8_4_ = local_78._8_4_ * fVar173;
      auVar42._12_4_ = local_78._12_4_ * fVar176;
      auVar42._16_4_ = local_78._16_4_ * fVar251;
      auVar42._20_4_ = local_78._20_4_ * fVar253;
      auVar42._24_4_ = local_78._24_4_ * fVar177;
      auVar42._28_4_ = auVar13._28_4_ + auVar14._28_4_;
      auVar201 = vfnmadd231ps_fma(auVar42,auVar91,auVar18);
      auVar14 = vminps_avx(ZEXT1632(auVar64),ZEXT1632(auVar9));
      auVar13 = vmaxps_avx(ZEXT1632(auVar64),ZEXT1632(auVar9));
      auVar15 = vminps_avx(ZEXT1632(auVar69),ZEXT1632(auVar95));
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar69),ZEXT1632(auVar95));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar16 = vminps_avx(ZEXT1632(auVar73),ZEXT1632(auVar268));
      auVar14 = vmaxps_avx(ZEXT1632(auVar73),ZEXT1632(auVar268));
      auVar17 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar201));
      auVar16 = vminps_avx(auVar16,auVar17);
      auVar16 = vminps_avx(auVar15,auVar16);
      auVar15 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar201));
      auVar14 = vmaxps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vcmpps_avx(auVar16,auVar49,2);
      auVar14 = vcmpps_avx(auVar14,auVar48,5);
      auVar13 = vandps_avx(auVar14,auVar13);
      auVar71 = vandps_avx(auVar71,local_288);
      auVar14 = auVar71 & auVar13;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar71 = vandps_avx(auVar13,auVar71);
        uVar52 = vmovmskps_avx(auVar71);
      }
    }
    if (uVar52 != 0) {
      auStack_3d8[uVar54] = uVar52;
      uVar155 = vmovlps_avx(local_358);
      *(undefined8 *)(&uStack_268 + uVar54 * 2) = uVar155;
      uVar59 = vmovlps_avx(local_678);
      auStack_58[uVar54] = uVar59;
      uVar54 = (ulong)((int)uVar54 + 1);
    }
    do {
      if ((int)uVar54 == 0) {
        uVar62 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar70._4_4_ = uVar62;
        auVar70._0_4_ = uVar62;
        auVar70._8_4_ = uVar62;
        auVar70._12_4_ = uVar62;
        auVar9 = vcmpps_avx(local_3a8,auVar70,2);
        uVar51 = vmovmskps_avx(auVar9);
        uVar51 = (uint)uVar60 & uVar51;
        if (uVar51 == 0) {
          return;
        }
        goto LAB_0167fb19;
      }
      uVar53 = (int)uVar54 - 1;
      uVar55 = (ulong)uVar53;
      uVar58 = auStack_3d8[uVar55];
      uVar52 = (&uStack_268)[uVar55 * 2];
      fVar132 = afStack_264[uVar55 * 2];
      iVar20 = 0;
      for (uVar59 = (ulong)uVar58; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
        iVar20 = iVar20 + 1;
      }
      uVar58 = uVar58 - 1 & uVar58;
      if (uVar58 == 0) {
        uVar54 = (ulong)uVar53;
      }
      local_678._8_8_ = 0;
      local_678._0_8_ = auStack_58[uVar55];
      auStack_3d8[uVar55] = uVar58;
      fVar148 = (float)(iVar20 + 1) * 0.14285715;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * (float)iVar20 * 0.14285715)),ZEXT416(uVar52)
                               ,ZEXT416((uint)(1.0 - (float)iVar20 * 0.14285715)));
      auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * fVar148)),ZEXT416(uVar52),
                                ZEXT416((uint)(1.0 - fVar148)));
      auVar172._0_4_ = auVar9._0_4_;
      fVar148 = auVar69._0_4_;
      fVar132 = fVar148 - auVar172._0_4_;
      if (0.16666667 <= fVar132) break;
      auVar268 = vshufps_avx(local_678,local_678,0x50);
      auVar97._8_4_ = 0x3f800000;
      auVar97._0_8_ = &DAT_3f8000003f800000;
      auVar97._12_4_ = 0x3f800000;
      auVar65 = vsubps_avx(auVar97,auVar268);
      fVar149 = auVar268._0_4_;
      auVar109._0_4_ = fVar149 * (float)local_428._0_4_;
      fVar150 = auVar268._4_4_;
      auVar109._4_4_ = fVar150 * (float)local_428._4_4_;
      fVar93 = auVar268._8_4_;
      auVar109._8_4_ = fVar93 * fStack_420;
      fVar94 = auVar268._12_4_;
      auVar109._12_4_ = fVar94 * fStack_41c;
      auVar120._0_4_ = fVar149 * (float)local_438._0_4_;
      auVar120._4_4_ = fVar150 * (float)local_438._4_4_;
      auVar120._8_4_ = fVar93 * fStack_430;
      auVar120._12_4_ = fVar94 * fStack_42c;
      auVar141._0_4_ = fVar149 * (float)local_448._0_4_;
      auVar141._4_4_ = fVar150 * (float)local_448._4_4_;
      auVar141._8_4_ = fVar93 * fStack_440;
      auVar141._12_4_ = fVar94 * fStack_43c;
      auVar82._0_4_ = fVar149 * (float)local_458._0_4_;
      auVar82._4_4_ = fVar150 * (float)local_458._4_4_;
      auVar82._8_4_ = fVar93 * fStack_450;
      auVar82._12_4_ = fVar94 * fStack_44c;
      auVar268 = vfmadd231ps_fma(auVar109,auVar65,local_3e8);
      auVar64 = vfmadd231ps_fma(auVar120,auVar65,local_3f8);
      auVar95 = vfmadd231ps_fma(auVar141,auVar65,local_408);
      auVar65 = vfmadd231ps_fma(auVar82,auVar65,local_418);
      auVar105._16_16_ = auVar268;
      auVar105._0_16_ = auVar268;
      auVar115._16_16_ = auVar64;
      auVar115._0_16_ = auVar64;
      auVar131._16_16_ = auVar95;
      auVar131._0_16_ = auVar95;
      auVar172._4_4_ = auVar172._0_4_;
      auVar172._8_4_ = auVar172._0_4_;
      auVar172._12_4_ = auVar172._0_4_;
      auVar172._20_4_ = fVar148;
      auVar172._16_4_ = fVar148;
      auVar172._24_4_ = fVar148;
      auVar172._28_4_ = fVar148;
      auVar71 = vsubps_avx(auVar115,auVar105);
      auVar64 = vfmadd213ps_fma(auVar71,auVar172,auVar105);
      auVar71 = vsubps_avx(auVar131,auVar115);
      auVar73 = vfmadd213ps_fma(auVar71,auVar172,auVar115);
      auVar268 = vsubps_avx(auVar65,auVar95);
      auVar116._16_16_ = auVar268;
      auVar116._0_16_ = auVar268;
      auVar268 = vfmadd213ps_fma(auVar116,auVar172,auVar131);
      auVar71 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar64));
      auVar65 = vfmadd213ps_fma(auVar71,auVar172,ZEXT1632(auVar64));
      auVar71 = vsubps_avx(ZEXT1632(auVar268),ZEXT1632(auVar73));
      auVar268 = vfmadd213ps_fma(auVar71,auVar172,ZEXT1632(auVar73));
      auVar71 = vsubps_avx(ZEXT1632(auVar268),ZEXT1632(auVar65));
      auVar106 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar71,auVar172);
      fVar174 = auVar71._4_4_ * 3.0;
      fVar63 = fVar132 * 0.33333334;
      local_2a8._0_8_ =
           CONCAT44(auVar106._4_4_ + fVar63 * fVar174,auVar106._0_4_ + fVar63 * auVar71._0_4_ * 3.0)
      ;
      local_2a8._8_4_ = auVar106._8_4_ + fVar63 * auVar71._8_4_ * 3.0;
      local_2a8._12_4_ = auVar106._12_4_ + fVar63 * auVar71._12_4_ * 3.0;
      auVar65 = vshufpd_avx(auVar106,auVar106,3);
      auVar64 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar268 = vsubps_avx(auVar65,auVar106);
      auVar95 = vsubps_avx(auVar64,(undefined1  [16])0x0);
      auVar98._0_4_ = auVar268._0_4_ + auVar95._0_4_;
      auVar98._4_4_ = auVar268._4_4_ + auVar95._4_4_;
      auVar98._8_4_ = auVar268._8_4_ + auVar95._8_4_;
      auVar98._12_4_ = auVar268._12_4_ + auVar95._12_4_;
      auVar268 = vshufps_avx(auVar106,auVar106,0xb1);
      auVar95 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar254._4_4_ = auVar98._0_4_;
      auVar254._0_4_ = auVar98._0_4_;
      auVar254._8_4_ = auVar98._0_4_;
      auVar254._12_4_ = auVar98._0_4_;
      auVar73 = vshufps_avx(auVar98,auVar98,0x55);
      fVar149 = auVar73._0_4_;
      auVar184._0_4_ = auVar268._0_4_ * fVar149;
      fVar150 = auVar73._4_4_;
      auVar184._4_4_ = auVar268._4_4_ * fVar150;
      fVar93 = auVar73._8_4_;
      auVar184._8_4_ = auVar268._8_4_ * fVar93;
      fVar94 = auVar73._12_4_;
      auVar184._12_4_ = auVar268._12_4_ * fVar94;
      auVar199._0_4_ = auVar95._0_4_ * fVar149;
      auVar199._4_4_ = auVar95._4_4_ * fVar150;
      auVar199._8_4_ = auVar95._8_4_ * fVar93;
      auVar199._12_4_ = auVar95._12_4_ * fVar94;
      auVar201 = vfmadd231ps_fma(auVar184,auVar254,auVar106);
      auVar74 = vfmadd231ps_fma(auVar199,auVar254,local_2a8._0_16_);
      auVar95 = vshufps_avx(auVar201,auVar201,0xe8);
      auVar73 = vshufps_avx(auVar74,auVar74,0xe8);
      auVar268 = vcmpps_avx(auVar95,auVar73,1);
      uVar52 = vextractps_avx(auVar268,0);
      auVar118 = auVar74;
      if ((uVar52 & 1) == 0) {
        auVar118 = auVar201;
      }
      auVar121._0_4_ = fVar63 * auVar71._16_4_ * 3.0;
      auVar121._4_4_ = fVar63 * fVar174;
      auVar121._8_4_ = fVar63 * auVar71._24_4_ * 3.0;
      auVar121._12_4_ = fVar63 * fVar148;
      auVar133 = vsubps_avx((undefined1  [16])0x0,auVar121);
      auVar122 = vshufps_avx(auVar133,auVar133,0xb1);
      auVar72 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar274._0_4_ = auVar122._0_4_ * fVar149;
      auVar274._4_4_ = auVar122._4_4_ * fVar150;
      auVar274._8_4_ = auVar122._8_4_ * fVar93;
      auVar274._12_4_ = auVar122._12_4_ * fVar94;
      auVar99._0_4_ = auVar72._0_4_ * fVar149;
      auVar99._4_4_ = auVar72._4_4_ * fVar150;
      auVar99._8_4_ = auVar72._8_4_ * fVar93;
      auVar99._12_4_ = auVar72._12_4_ * fVar94;
      auVar134 = vfmadd231ps_fma(auVar274,auVar254,auVar133);
      auVar135 = vfmadd231ps_fma(auVar99,(undefined1  [16])0x0,auVar254);
      auVar72 = vshufps_avx(auVar134,auVar134,0xe8);
      auVar117 = vshufps_avx(auVar135,auVar135,0xe8);
      auVar122 = vcmpps_avx(auVar72,auVar117,1);
      uVar52 = vextractps_avx(auVar122,0);
      auVar180 = auVar135;
      if ((uVar52 & 1) == 0) {
        auVar180 = auVar134;
      }
      auVar118 = vmaxss_avx(auVar180,auVar118);
      auVar95 = vminps_avx(auVar95,auVar73);
      auVar73 = vminps_avx(auVar72,auVar117);
      auVar73 = vminps_avx(auVar95,auVar73);
      auVar268 = vshufps_avx(auVar268,auVar268,0x55);
      auVar268 = vblendps_avx(auVar268,auVar122,2);
      auVar122 = vpslld_avx(auVar268,0x1f);
      auVar268 = vshufpd_avx(auVar74,auVar74,1);
      auVar268 = vinsertps_avx(auVar268,auVar135,0x9c);
      auVar95 = vshufpd_avx(auVar201,auVar201,1);
      auVar95 = vinsertps_avx(auVar95,auVar134,0x9c);
      auVar268 = vblendvps_avx(auVar95,auVar268,auVar122);
      auVar95 = vmovshdup_avx(auVar268);
      auVar268 = vmaxss_avx(auVar95,auVar268);
      fVar93 = auVar73._0_4_;
      auVar95 = vmovshdup_avx(auVar73);
      fVar150 = auVar268._0_4_;
      fVar149 = auVar118._0_4_;
      if ((0.0001 <= fVar93) || (fVar150 <= -0.0001)) {
        auVar201 = vcmpps_avx(auVar95,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar74 = vcmpps_avx(auVar73,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar201 = vorps_avx(auVar74,auVar201);
        if ((-0.0001 < fVar149 & auVar201[0]) != 0) goto LAB_01680c12;
        auVar201 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar268,5);
        auVar74 = vcmpps_avx(auVar95,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar201 = vorps_avx(auVar74,auVar201);
        if ((auVar201 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_01680c12;
LAB_016815d1:
        bVar43 = true;
      }
      else {
LAB_01680c12:
        auVar74 = vcmpps_avx(auVar73,_DAT_01feba10,1);
        auVar122 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar201 = vcmpss_avx(auVar118,ZEXT816(0) << 0x20,1);
        auVar142._8_4_ = 0x3f800000;
        auVar142._0_8_ = &DAT_3f8000003f800000;
        auVar142._12_4_ = 0x3f800000;
        auVar200._8_4_ = 0xbf800000;
        auVar200._0_8_ = 0xbf800000bf800000;
        auVar200._12_4_ = 0xbf800000;
        auVar201 = vblendvps_avx(auVar142,auVar200,auVar201);
        auVar74 = vblendvps_avx(auVar142,auVar200,auVar74);
        fVar94 = auVar74._0_4_;
        fVar63 = auVar201._0_4_;
        auVar201 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar94 == fVar63) && (!NAN(fVar94) && !NAN(fVar63))) {
          auVar201 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar72 = ZEXT816(0) << 0x20;
        if ((fVar94 == fVar63) && (!NAN(fVar94) && !NAN(fVar63))) {
          auVar122 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar74 = vmovshdup_avx(auVar74);
        fVar174 = auVar74._0_4_;
        if ((fVar94 != fVar174) || (NAN(fVar94) || NAN(fVar174))) {
          fVar94 = auVar95._0_4_;
          if ((fVar94 != fVar93) || (NAN(fVar94) || NAN(fVar93))) {
            auVar100._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
            auVar100._8_4_ = auVar73._8_4_ ^ 0x80000000;
            auVar100._12_4_ = auVar73._12_4_ ^ 0x80000000;
            auVar123._0_4_ = -fVar93 / (fVar94 - fVar93);
            auVar123._4_12_ = auVar100._4_12_;
            auVar95 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar123._0_4_)),auVar72,auVar123);
            auVar73 = auVar95;
          }
          else {
            auVar95 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar93 == 0.0) && (auVar95 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar93))) {
              auVar95 = ZEXT816(0);
            }
            auVar73 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar93 == 0.0) && (auVar73 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar93))) {
              auVar73 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar201 = vminss_avx(auVar201,auVar95);
          auVar122 = vmaxss_avx(auVar73,auVar122);
        }
        auVar268 = vcmpss_avx(auVar268,auVar72,1);
        auVar124._8_4_ = 0x3f800000;
        auVar124._0_8_ = &DAT_3f8000003f800000;
        auVar124._12_4_ = 0x3f800000;
        auVar143._8_4_ = 0xbf800000;
        auVar143._0_8_ = 0xbf800000bf800000;
        auVar143._12_4_ = 0xbf800000;
        auVar268 = vblendvps_avx(auVar124,auVar143,auVar268);
        fVar93 = auVar268._0_4_;
        auVar268 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar63 != fVar93) || (NAN(fVar63) || NAN(fVar93))) {
          if ((fVar150 != fVar149) || (NAN(fVar150) || NAN(fVar149))) {
            auVar101._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
            auVar101._8_4_ = auVar118._8_4_ ^ 0x80000000;
            auVar101._12_4_ = auVar118._12_4_ ^ 0x80000000;
            auVar125._0_4_ = -fVar149 / (fVar150 - fVar149);
            auVar125._4_12_ = auVar101._4_12_;
            auVar95 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar125._0_4_)),auVar72,auVar125);
            auVar73 = auVar95;
          }
          else {
            auVar95 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar149 == 0.0) && (auVar95 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar149))) {
              auVar95 = ZEXT816(0);
            }
            auVar73 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar149 == 0.0) && (auVar73 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar149))) {
              auVar73 = auVar268;
            }
          }
          auVar201 = vminss_avx(auVar201,auVar95);
          auVar122 = vmaxss_avx(auVar73,auVar122);
        }
        if ((fVar174 != fVar93) || (NAN(fVar174) || NAN(fVar93))) {
          auVar201 = vminss_avx(auVar201,auVar268);
          auVar122 = vmaxss_avx(auVar268,auVar122);
        }
        auVar95 = vmaxss_avx(auVar72,auVar201);
        auVar73 = vminss_avx(auVar122,auVar268);
        bVar43 = true;
        if (auVar95._0_4_ <= auVar73._0_4_) {
          auVar95 = vmaxss_avx(auVar72,ZEXT416((uint)(auVar95._0_4_ + -0.1)));
          auVar268 = vminss_avx(ZEXT416((uint)(auVar73._0_4_ + 0.1)),auVar268);
          auVar83._0_8_ = auVar106._0_8_;
          auVar83._8_8_ = auVar83._0_8_;
          auVar202._8_8_ = local_2a8._0_8_;
          auVar202._0_8_ = local_2a8._0_8_;
          auVar215._8_8_ = auVar133._0_8_;
          auVar215._0_8_ = auVar133._0_8_;
          auVar73 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
          auVar201 = vshufpd_avx(auVar133,auVar133,3);
          auVar74 = vshufps_avx(auVar95,auVar268,0);
          auVar110._8_4_ = 0x3f800000;
          auVar110._0_8_ = &DAT_3f8000003f800000;
          auVar110._12_4_ = 0x3f800000;
          auVar106 = vsubps_avx(auVar110,auVar74);
          local_598._0_4_ = auVar65._0_4_;
          local_598._4_4_ = auVar65._4_4_;
          fStack_590 = auVar65._8_4_;
          fStack_58c = auVar65._12_4_;
          fVar149 = auVar74._0_4_;
          auVar111._0_4_ = fVar149 * (float)local_598._0_4_;
          fVar150 = auVar74._4_4_;
          auVar111._4_4_ = fVar150 * (float)local_598._4_4_;
          fVar93 = auVar74._8_4_;
          auVar111._8_4_ = fVar93 * fStack_590;
          fVar94 = auVar74._12_4_;
          auVar111._12_4_ = fVar94 * fStack_58c;
          auVar126._0_4_ = auVar73._0_4_ * fVar149;
          auVar126._4_4_ = auVar73._4_4_ * fVar150;
          auVar126._8_4_ = auVar73._8_4_ * fVar93;
          auVar126._12_4_ = auVar73._12_4_ * fVar94;
          auVar144._0_4_ = auVar201._0_4_ * fVar149;
          auVar144._4_4_ = auVar201._4_4_ * fVar150;
          auVar144._8_4_ = auVar201._8_4_ * fVar93;
          auVar144._12_4_ = auVar201._12_4_ * fVar94;
          local_5b8._0_4_ = auVar64._0_4_;
          local_5b8._4_4_ = auVar64._4_4_;
          uStack_5b0._0_4_ = auVar64._8_4_;
          uStack_5b0._4_4_ = auVar64._12_4_;
          auVar167._0_4_ = fVar149 * (float)local_5b8._0_4_;
          auVar167._4_4_ = fVar150 * (float)local_5b8._4_4_;
          auVar167._8_4_ = fVar93 * (float)uStack_5b0;
          auVar167._12_4_ = fVar94 * uStack_5b0._4_4_;
          auVar73 = vfmadd231ps_fma(auVar111,auVar106,auVar83);
          auVar201 = vfmadd231ps_fma(auVar126,auVar106,auVar202);
          auVar74 = vfmadd231ps_fma(auVar144,auVar106,auVar215);
          auVar106 = vfmadd231ps_fma(auVar167,auVar106,ZEXT816(0));
          auVar65 = vmovshdup_avx(local_678);
          auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar95._0_4_)),local_678,
                                    ZEXT416((uint)(1.0 - auVar95._0_4_)));
          auVar117 = vfmadd231ss_fma(ZEXT416((uint)(auVar65._0_4_ * auVar268._0_4_)),local_678,
                                     ZEXT416((uint)(1.0 - auVar268._0_4_)));
          fVar149 = 1.0 / fVar132;
          auVar268 = vsubps_avx(auVar201,auVar73);
          auVar185._0_4_ = auVar268._0_4_ * 3.0;
          auVar185._4_4_ = auVar268._4_4_ * 3.0;
          auVar185._8_4_ = auVar268._8_4_ * 3.0;
          auVar185._12_4_ = auVar268._12_4_ * 3.0;
          auVar268 = vsubps_avx(auVar74,auVar201);
          auVar203._0_4_ = auVar268._0_4_ * 3.0;
          auVar203._4_4_ = auVar268._4_4_ * 3.0;
          auVar203._8_4_ = auVar268._8_4_ * 3.0;
          auVar203._12_4_ = auVar268._12_4_ * 3.0;
          auVar268 = vsubps_avx(auVar106,auVar74);
          auVar216._0_4_ = auVar268._0_4_ * 3.0;
          auVar216._4_4_ = auVar268._4_4_ * 3.0;
          auVar216._8_4_ = auVar268._8_4_ * 3.0;
          auVar216._12_4_ = auVar268._12_4_ * 3.0;
          auVar65 = vminps_avx(auVar203,auVar216);
          auVar268 = vmaxps_avx(auVar203,auVar216);
          auVar65 = vminps_avx(auVar185,auVar65);
          auVar268 = vmaxps_avx(auVar185,auVar268);
          auVar64 = vshufpd_avx(auVar65,auVar65,3);
          auVar95 = vshufpd_avx(auVar268,auVar268,3);
          auVar65 = vminps_avx(auVar65,auVar64);
          auVar268 = vmaxps_avx(auVar268,auVar95);
          auVar204._0_4_ = auVar65._0_4_ * fVar149;
          auVar204._4_4_ = auVar65._4_4_ * fVar149;
          auVar204._8_4_ = auVar65._8_4_ * fVar149;
          auVar204._12_4_ = auVar65._12_4_ * fVar149;
          auVar186._0_4_ = fVar149 * auVar268._0_4_;
          auVar186._4_4_ = fVar149 * auVar268._4_4_;
          auVar186._8_4_ = fVar149 * auVar268._8_4_;
          auVar186._12_4_ = fVar149 * auVar268._12_4_;
          fVar149 = 1.0 / (auVar117._0_4_ - auVar72._0_4_);
          auVar268 = vshufpd_avx(auVar73,auVar73,3);
          auVar65 = vshufpd_avx(auVar201,auVar201,3);
          auVar64 = vshufpd_avx(auVar74,auVar74,3);
          auVar95 = vshufpd_avx(auVar106,auVar106,3);
          auVar268 = vsubps_avx(auVar268,auVar73);
          auVar73 = vsubps_avx(auVar65,auVar201);
          auVar201 = vsubps_avx(auVar64,auVar74);
          auVar95 = vsubps_avx(auVar95,auVar106);
          auVar65 = vminps_avx(auVar268,auVar73);
          auVar268 = vmaxps_avx(auVar268,auVar73);
          auVar64 = vminps_avx(auVar201,auVar95);
          auVar64 = vminps_avx(auVar65,auVar64);
          auVar65 = vmaxps_avx(auVar201,auVar95);
          auVar268 = vmaxps_avx(auVar268,auVar65);
          auVar234._0_4_ = fVar149 * auVar64._0_4_;
          auVar234._4_4_ = fVar149 * auVar64._4_4_;
          auVar234._8_4_ = fVar149 * auVar64._8_4_;
          auVar234._12_4_ = fVar149 * auVar64._12_4_;
          auVar222._0_4_ = fVar149 * auVar268._0_4_;
          auVar222._4_4_ = fVar149 * auVar268._4_4_;
          auVar222._8_4_ = fVar149 * auVar268._8_4_;
          auVar222._12_4_ = fVar149 * auVar268._12_4_;
          auVar95 = vinsertps_avx(auVar9,auVar72,0x10);
          auVar73 = vinsertps_avx(auVar69,auVar117,0x10);
          auVar68._0_4_ = (auVar95._0_4_ + auVar73._0_4_) * 0.5;
          auVar68._4_4_ = (auVar95._4_4_ + auVar73._4_4_) * 0.5;
          auVar68._8_4_ = (auVar95._8_4_ + auVar73._8_4_) * 0.5;
          auVar68._12_4_ = (auVar95._12_4_ + auVar73._12_4_) * 0.5;
          auVar112._4_4_ = auVar68._0_4_;
          auVar112._0_4_ = auVar68._0_4_;
          auVar112._8_4_ = auVar68._0_4_;
          auVar112._12_4_ = auVar68._0_4_;
          auVar268 = vfmadd213ps_fma(local_2b8,auVar112,auVar10);
          auVar65 = vfmadd213ps_fma(local_2c8,auVar112,auVar11);
          auVar64 = vfmadd213ps_fma(local_2d8,auVar112,auVar12);
          auVar69 = vsubps_avx(auVar65,auVar268);
          auVar268 = vfmadd213ps_fma(auVar69,auVar112,auVar268);
          auVar69 = vsubps_avx(auVar64,auVar65);
          auVar69 = vfmadd213ps_fma(auVar69,auVar112,auVar65);
          auVar69 = vsubps_avx(auVar69,auVar268);
          auVar268 = vfmadd231ps_fma(auVar268,auVar69,auVar112);
          auVar113._0_8_ = CONCAT44(auVar69._4_4_ * 3.0,auVar69._0_4_ * 3.0);
          auVar113._8_4_ = auVar69._8_4_ * 3.0;
          auVar113._12_4_ = auVar69._12_4_ * 3.0;
          auVar217._8_8_ = auVar268._0_8_;
          auVar217._0_8_ = auVar268._0_8_;
          auVar69 = vshufpd_avx(auVar268,auVar268,3);
          auVar268 = vshufps_avx(auVar68,auVar68,0x55);
          auVar201 = vsubps_avx(auVar69,auVar217);
          auVar106 = vfmadd231ps_fma(auVar217,auVar268,auVar201);
          auVar255._8_8_ = auVar113._0_8_;
          auVar255._0_8_ = auVar113._0_8_;
          auVar69 = vshufpd_avx(auVar113,auVar113,3);
          auVar69 = vsubps_avx(auVar69,auVar255);
          auVar74 = vfmadd213ps_fma(auVar69,auVar268,auVar255);
          auVar268 = vmovshdup_avx(auVar74);
          auVar256._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
          auVar256._8_4_ = auVar268._8_4_ ^ 0x80000000;
          auVar256._12_4_ = auVar268._12_4_ ^ 0x80000000;
          auVar65 = vmovshdup_avx(auVar201);
          auVar69 = vunpcklps_avx(auVar65,auVar256);
          auVar64 = vshufps_avx(auVar69,auVar256,4);
          auVar275._0_8_ = auVar201._0_8_ ^ 0x8000000080000000;
          auVar275._8_4_ = auVar201._8_4_ ^ 0x80000000;
          auVar275._12_4_ = auVar201._12_4_ ^ 0x80000000;
          auVar69 = vmovlhps_avx(auVar275,auVar74);
          auVar69 = vshufps_avx(auVar69,auVar74,8);
          auVar268 = vfmsub231ss_fma(ZEXT416((uint)(auVar268._0_4_ * auVar201._0_4_)),auVar65,
                                     auVar74);
          auVar127._0_4_ = auVar268._0_4_;
          auVar127._4_4_ = auVar127._0_4_;
          auVar127._8_4_ = auVar127._0_4_;
          auVar127._12_4_ = auVar127._0_4_;
          auVar268 = vdivps_avx(auVar64,auVar127);
          auVar65 = vdivps_avx(auVar69,auVar127);
          fVar93 = auVar106._0_4_;
          fVar149 = auVar268._0_4_;
          auVar69 = vshufps_avx(auVar106,auVar106,0x55);
          fVar150 = auVar65._0_4_;
          local_5b8._4_4_ = fVar93 * auVar268._4_4_ + auVar69._4_4_ * auVar65._4_4_;
          local_5b8._0_4_ = fVar93 * fVar149 + auVar69._0_4_ * fVar150;
          uStack_5b0._0_4_ = fVar93 * auVar268._8_4_ + auVar69._8_4_ * auVar65._8_4_;
          uStack_5b0._4_4_ = fVar93 * auVar268._12_4_ + auVar69._12_4_ * auVar65._12_4_;
          auVar201 = vmovshdup_avx(auVar268);
          auVar69 = vinsertps_avx(auVar204,auVar234,0x1c);
          auVar269._0_4_ = auVar201._0_4_ * auVar69._0_4_;
          auVar269._4_4_ = auVar201._4_4_ * auVar69._4_4_;
          auVar269._8_4_ = auVar201._8_4_ * auVar69._8_4_;
          auVar269._12_4_ = auVar201._12_4_ * auVar69._12_4_;
          auVar64 = vinsertps_avx(auVar186,auVar222,0x1c);
          auVar243._0_4_ = auVar201._0_4_ * auVar64._0_4_;
          auVar243._4_4_ = auVar201._4_4_ * auVar64._4_4_;
          auVar243._8_4_ = auVar201._8_4_ * auVar64._8_4_;
          auVar243._12_4_ = auVar201._12_4_ * auVar64._12_4_;
          auVar118 = vminps_avx(auVar269,auVar243);
          auVar106 = vmaxps_avx(auVar243,auVar269);
          auVar201 = vinsertps_avx(auVar234,auVar204,0x4c);
          auVar122 = vmovshdup_avx(auVar65);
          auVar74 = vinsertps_avx(auVar222,auVar186,0x4c);
          auVar223._0_4_ = auVar122._0_4_ * auVar201._0_4_;
          auVar223._4_4_ = auVar122._4_4_ * auVar201._4_4_;
          auVar223._8_4_ = auVar122._8_4_ * auVar201._8_4_;
          auVar223._12_4_ = auVar122._12_4_ * auVar201._12_4_;
          auVar235._0_4_ = auVar122._0_4_ * auVar74._0_4_;
          auVar235._4_4_ = auVar122._4_4_ * auVar74._4_4_;
          auVar235._8_4_ = auVar122._8_4_ * auVar74._8_4_;
          auVar235._12_4_ = auVar122._12_4_ * auVar74._12_4_;
          auVar122 = vminps_avx(auVar223,auVar235);
          auVar84._0_4_ = auVar122._0_4_ + auVar118._0_4_;
          auVar84._4_4_ = auVar122._4_4_ + auVar118._4_4_;
          auVar84._8_4_ = auVar122._8_4_ + auVar118._8_4_;
          auVar84._12_4_ = auVar122._12_4_ + auVar118._12_4_;
          auVar118 = vmaxps_avx(auVar235,auVar223);
          auVar224._0_4_ = auVar106._0_4_ + auVar118._0_4_;
          auVar224._4_4_ = auVar106._4_4_ + auVar118._4_4_;
          auVar224._8_4_ = auVar106._8_4_ + auVar118._8_4_;
          auVar224._12_4_ = auVar106._12_4_ + auVar118._12_4_;
          auVar236._8_8_ = 0x3f80000000000000;
          auVar236._0_8_ = 0x3f80000000000000;
          auVar106 = vsubps_avx(auVar236,auVar224);
          auVar118 = vsubps_avx(auVar236,auVar84);
          auVar122 = vsubps_avx(auVar95,auVar68);
          auVar257._0_4_ = fVar149 * auVar69._0_4_;
          auVar257._4_4_ = fVar149 * auVar69._4_4_;
          auVar257._8_4_ = fVar149 * auVar69._8_4_;
          auVar257._12_4_ = fVar149 * auVar69._12_4_;
          auVar244._0_4_ = fVar149 * auVar64._0_4_;
          auVar244._4_4_ = fVar149 * auVar64._4_4_;
          auVar244._8_4_ = fVar149 * auVar64._8_4_;
          auVar244._12_4_ = fVar149 * auVar64._12_4_;
          auVar64 = vminps_avx(auVar257,auVar244);
          auVar69 = vmaxps_avx(auVar244,auVar257);
          auVar205._0_4_ = fVar150 * auVar201._0_4_;
          auVar205._4_4_ = fVar150 * auVar201._4_4_;
          auVar205._8_4_ = fVar150 * auVar201._8_4_;
          auVar205._12_4_ = fVar150 * auVar201._12_4_;
          auVar187._0_4_ = fVar150 * auVar74._0_4_;
          auVar187._4_4_ = fVar150 * auVar74._4_4_;
          auVar187._8_4_ = fVar150 * auVar74._8_4_;
          auVar187._12_4_ = fVar150 * auVar74._12_4_;
          auVar201 = vminps_avx(auVar205,auVar187);
          auVar258._0_4_ = auVar64._0_4_ + auVar201._0_4_;
          auVar258._4_4_ = auVar64._4_4_ + auVar201._4_4_;
          auVar258._8_4_ = auVar64._8_4_ + auVar201._8_4_;
          auVar258._12_4_ = auVar64._12_4_ + auVar201._12_4_;
          auVar201 = vsubps_avx(auVar73,auVar68);
          auVar64 = vmaxps_avx(auVar187,auVar205);
          fVar93 = auVar122._0_4_;
          auVar206._0_4_ = fVar93 * auVar106._0_4_;
          fVar94 = auVar122._4_4_;
          auVar206._4_4_ = fVar94 * auVar106._4_4_;
          fVar63 = auVar122._8_4_;
          auVar206._8_4_ = fVar63 * auVar106._8_4_;
          fVar174 = auVar122._12_4_;
          auVar206._12_4_ = fVar174 * auVar106._12_4_;
          auVar188._0_4_ = auVar69._0_4_ + auVar64._0_4_;
          auVar188._4_4_ = auVar69._4_4_ + auVar64._4_4_;
          auVar188._8_4_ = auVar69._8_4_ + auVar64._8_4_;
          auVar188._12_4_ = auVar69._12_4_ + auVar64._12_4_;
          auVar245._8_8_ = 0x3f800000;
          auVar245._0_8_ = 0x3f800000;
          auVar69 = vsubps_avx(auVar245,auVar188);
          auVar64 = vsubps_avx(auVar245,auVar258);
          auVar259._0_4_ = fVar93 * auVar118._0_4_;
          auVar259._4_4_ = fVar94 * auVar118._4_4_;
          auVar259._8_4_ = fVar63 * auVar118._8_4_;
          auVar259._12_4_ = fVar174 * auVar118._12_4_;
          fVar151 = auVar201._0_4_;
          auVar225._0_4_ = fVar151 * auVar106._0_4_;
          fVar152 = auVar201._4_4_;
          auVar225._4_4_ = fVar152 * auVar106._4_4_;
          fVar153 = auVar201._8_4_;
          auVar225._8_4_ = fVar153 * auVar106._8_4_;
          fVar154 = auVar201._12_4_;
          auVar225._12_4_ = fVar154 * auVar106._12_4_;
          auVar85._0_4_ = fVar151 * auVar118._0_4_;
          auVar85._4_4_ = fVar152 * auVar118._4_4_;
          auVar85._8_4_ = fVar153 * auVar118._8_4_;
          auVar85._12_4_ = fVar154 * auVar118._12_4_;
          auVar276._0_4_ = fVar93 * auVar69._0_4_;
          auVar276._4_4_ = fVar94 * auVar69._4_4_;
          auVar276._8_4_ = fVar63 * auVar69._8_4_;
          auVar276._12_4_ = fVar174 * auVar69._12_4_;
          auVar237._0_4_ = fVar93 * auVar64._0_4_;
          auVar237._4_4_ = fVar94 * auVar64._4_4_;
          auVar237._8_4_ = fVar63 * auVar64._8_4_;
          auVar237._12_4_ = fVar174 * auVar64._12_4_;
          auVar189._0_4_ = fVar151 * auVar69._0_4_;
          auVar189._4_4_ = fVar152 * auVar69._4_4_;
          auVar189._8_4_ = fVar153 * auVar69._8_4_;
          auVar189._12_4_ = fVar154 * auVar69._12_4_;
          auVar246._0_4_ = fVar151 * auVar64._0_4_;
          auVar246._4_4_ = fVar152 * auVar64._4_4_;
          auVar246._8_4_ = fVar153 * auVar64._8_4_;
          auVar246._12_4_ = fVar154 * auVar64._12_4_;
          auVar69 = vminps_avx(auVar276,auVar237);
          auVar64 = vminps_avx(auVar189,auVar246);
          auVar69 = vminps_avx(auVar69,auVar64);
          auVar64 = vmaxps_avx(auVar237,auVar276);
          auVar201 = vminps_avx(auVar206,auVar259);
          auVar74 = vminps_avx(auVar225,auVar85);
          auVar201 = vminps_avx(auVar201,auVar74);
          auVar69 = vhaddps_avx(auVar69,auVar201);
          auVar201 = vmaxps_avx(auVar246,auVar189);
          auVar64 = vmaxps_avx(auVar201,auVar64);
          auVar201 = vmaxps_avx(auVar259,auVar206);
          auVar74 = vmaxps_avx(auVar85,auVar225);
          auVar201 = vmaxps_avx(auVar74,auVar201);
          auVar64 = vhaddps_avx(auVar64,auVar201);
          auVar201 = vshufps_avx(auVar68,auVar68,0x54);
          auVar201 = vsubps_avx(auVar201,_local_5b8);
          auVar69 = vshufps_avx(auVar69,auVar69,0xe8);
          auVar64 = vshufps_avx(auVar64,auVar64,0xe8);
          auVar207._0_4_ = auVar201._0_4_ + auVar69._0_4_;
          auVar207._4_4_ = auVar201._4_4_ + auVar69._4_4_;
          auVar207._8_4_ = auVar201._8_4_ + auVar69._8_4_;
          auVar207._12_4_ = auVar201._12_4_ + auVar69._12_4_;
          auVar190._0_4_ = auVar201._0_4_ + auVar64._0_4_;
          auVar190._4_4_ = auVar201._4_4_ + auVar64._4_4_;
          auVar190._8_4_ = auVar201._8_4_ + auVar64._8_4_;
          auVar190._12_4_ = auVar201._12_4_ + auVar64._12_4_;
          auVar69 = vmaxps_avx(auVar95,auVar207);
          auVar64 = vminps_avx(auVar190,auVar73);
          auVar69 = vcmpps_avx(auVar64,auVar69,1);
          auVar69 = vshufps_avx(auVar69,auVar69,0x50);
          local_678 = vinsertps_avx(auVar72,ZEXT416((uint)auVar117._0_4_),0x10);
          if ((auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar69[0xf] < '\0') goto LAB_016815d1;
          bVar57 = 0;
          if ((auVar172._0_4_ < auVar207._0_4_) && (bVar57 = 0, auVar190._0_4_ < auVar73._0_4_)) {
            auVar64 = vmovshdup_avx(auVar207);
            auVar69 = vcmpps_avx(auVar190,auVar73,1);
            bVar57 = auVar69[4] & auVar72._0_4_ < auVar64._0_4_;
          }
          if (((3 < (uint)uVar54 || fVar132 < 0.001) | bVar57) == 1) {
            lVar56 = 200;
            do {
              fVar63 = auVar201._0_4_;
              fVar94 = 1.0 - fVar63;
              fVar132 = fVar94 * fVar94 * fVar94;
              fVar93 = fVar63 * 3.0 * fVar94 * fVar94;
              fVar94 = fVar94 * fVar63 * fVar63 * 3.0;
              auVar145._4_4_ = fVar132;
              auVar145._0_4_ = fVar132;
              auVar145._8_4_ = fVar132;
              auVar145._12_4_ = fVar132;
              auVar102._4_4_ = fVar93;
              auVar102._0_4_ = fVar93;
              auVar102._8_4_ = fVar93;
              auVar102._12_4_ = fVar93;
              auVar86._4_4_ = fVar94;
              auVar86._0_4_ = fVar94;
              auVar86._8_4_ = fVar94;
              auVar86._12_4_ = fVar94;
              fVar63 = fVar63 * fVar63 * fVar63;
              auVar168._0_4_ = (float)local_468._0_4_ * fVar63;
              auVar168._4_4_ = (float)local_468._4_4_ * fVar63;
              auVar168._8_4_ = fStack_460 * fVar63;
              auVar168._12_4_ = fStack_45c * fVar63;
              auVar69 = vfmadd231ps_fma(auVar168,auVar12,auVar86);
              auVar69 = vfmadd231ps_fma(auVar69,auVar11,auVar102);
              auVar69 = vfmadd231ps_fma(auVar69,auVar10,auVar145);
              auVar87._8_8_ = auVar69._0_8_;
              auVar87._0_8_ = auVar69._0_8_;
              auVar69 = vshufpd_avx(auVar69,auVar69,3);
              auVar64 = vshufps_avx(auVar201,auVar201,0x55);
              auVar69 = vsubps_avx(auVar69,auVar87);
              auVar64 = vfmadd213ps_fma(auVar69,auVar64,auVar87);
              fVar132 = auVar64._0_4_;
              auVar69 = vshufps_avx(auVar64,auVar64,0x55);
              auVar88._0_4_ = fVar149 * fVar132 + fVar150 * auVar69._0_4_;
              auVar88._4_4_ = auVar268._4_4_ * fVar132 + auVar65._4_4_ * auVar69._4_4_;
              auVar88._8_4_ = auVar268._8_4_ * fVar132 + auVar65._8_4_ * auVar69._8_4_;
              auVar88._12_4_ = auVar268._12_4_ * fVar132 + auVar65._12_4_ * auVar69._12_4_;
              auVar201 = vsubps_avx(auVar201,auVar88);
              auVar69 = vandps_avx(auVar273,auVar64);
              auVar64 = vshufps_avx(auVar69,auVar69,0xf5);
              auVar69 = vmaxss_avx(auVar64,auVar69);
              if (auVar69._0_4_ < (float)local_2e8._0_4_) {
                local_218 = auVar201._0_4_;
                if ((0.0 <= local_218) && (local_218 <= 1.0)) {
                  auVar69 = vmovshdup_avx(auVar201);
                  fVar132 = auVar69._0_4_;
                  if ((0.0 <= fVar132) && (fVar132 <= 1.0)) {
                    auVar69 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar106 = vinsertps_avx(auVar69,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar69 = vdpps_avx(auVar106,local_478,0x7f);
                    auVar268 = vdpps_avx(auVar106,local_488,0x7f);
                    auVar65 = vdpps_avx(auVar106,local_2f8,0x7f);
                    auVar64 = vdpps_avx(auVar106,local_308,0x7f);
                    auVar95 = vdpps_avx(auVar106,local_318,0x7f);
                    auVar73 = vdpps_avx(auVar106,local_328,0x7f);
                    auVar74 = vdpps_avx(auVar106,local_338,0x7f);
                    auVar106 = vdpps_avx(auVar106,local_348,0x7f);
                    fVar149 = 1.0 - fVar132;
                    auVar69 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * auVar95._0_4_)),
                                              ZEXT416((uint)fVar149),auVar69);
                    auVar268 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * fVar132)),
                                               ZEXT416((uint)fVar149),auVar268);
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * fVar132)),
                                              ZEXT416((uint)fVar149),auVar65);
                    auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar132 * auVar106._0_4_)),
                                              ZEXT416((uint)fVar149),auVar64);
                    fVar94 = 1.0 - local_218;
                    fVar149 = fVar94 * local_218 * local_218 * 3.0;
                    fVar174 = local_218 * local_218 * local_218;
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * auVar64._0_4_)),
                                              ZEXT416((uint)fVar149),auVar65);
                    fVar150 = local_218 * 3.0 * fVar94 * fVar94;
                    auVar268 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar150),auVar268);
                    fVar93 = fVar94 * fVar94 * fVar94;
                    auVar69 = vfmadd231ss_fma(auVar268,ZEXT416((uint)fVar93),auVar69);
                    fVar63 = auVar69._0_4_;
                    if (((fVar61 <= fVar63) &&
                        (fVar151 = *(float *)(ray + k * 4 + 0x80), fVar63 <= fVar151)) &&
                       (pGVar5 = (context->scene->geometries).items[uVar51].ptr,
                       (pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                      auVar69 = vshufps_avx(auVar201,auVar201,0x55);
                      auVar218._8_4_ = 0x3f800000;
                      auVar218._0_8_ = &DAT_3f8000003f800000;
                      auVar218._12_4_ = 0x3f800000;
                      auVar268 = vsubps_avx(auVar218,auVar69);
                      fVar152 = auVar69._0_4_;
                      auVar226._0_4_ = fVar152 * (float)local_4a8._0_4_;
                      fVar153 = auVar69._4_4_;
                      auVar226._4_4_ = fVar153 * (float)local_4a8._4_4_;
                      fVar154 = auVar69._8_4_;
                      auVar226._8_4_ = fVar154 * fStack_4a0;
                      fVar173 = auVar69._12_4_;
                      auVar226._12_4_ = fVar173 * fStack_49c;
                      auVar238._0_4_ = fVar152 * (float)local_4f8._0_4_;
                      auVar238._4_4_ = fVar153 * (float)local_4f8._4_4_;
                      auVar238._8_4_ = fVar154 * fStack_4f0;
                      auVar238._12_4_ = fVar173 * fStack_4ec;
                      auVar247._0_4_ = fVar152 * (float)local_508._0_4_;
                      auVar247._4_4_ = fVar153 * (float)local_508._4_4_;
                      auVar247._8_4_ = fVar154 * fStack_500;
                      auVar247._12_4_ = fVar173 * fStack_4fc;
                      auVar260._0_4_ = fVar152 * (float)local_4c8._0_4_;
                      auVar260._4_4_ = fVar153 * (float)local_4c8._4_4_;
                      auVar260._8_4_ = fVar154 * fStack_4c0;
                      auVar260._12_4_ = fVar173 * fStack_4bc;
                      auVar65 = vfmadd231ps_fma(auVar226,auVar268,local_498);
                      auVar64 = vfmadd231ps_fma(auVar238,auVar268,local_4d8);
                      auVar95 = vfmadd231ps_fma(auVar247,auVar268,local_4e8);
                      auVar73 = vfmadd231ps_fma(auVar260,auVar268,local_4b8);
                      auVar268 = vsubps_avx(auVar64,auVar65);
                      auVar65 = vsubps_avx(auVar95,auVar64);
                      auVar64 = vsubps_avx(auVar73,auVar95);
                      auVar261._0_4_ = local_218 * auVar65._0_4_;
                      auVar261._4_4_ = local_218 * auVar65._4_4_;
                      auVar261._8_4_ = local_218 * auVar65._8_4_;
                      auVar261._12_4_ = local_218 * auVar65._12_4_;
                      auVar208._4_4_ = fVar94;
                      auVar208._0_4_ = fVar94;
                      auVar208._8_4_ = fVar94;
                      auVar208._12_4_ = fVar94;
                      auVar268 = vfmadd231ps_fma(auVar261,auVar208,auVar268);
                      auVar227._0_4_ = local_218 * auVar64._0_4_;
                      auVar227._4_4_ = local_218 * auVar64._4_4_;
                      auVar227._8_4_ = local_218 * auVar64._8_4_;
                      auVar227._12_4_ = local_218 * auVar64._12_4_;
                      auVar65 = vfmadd231ps_fma(auVar227,auVar208,auVar65);
                      auVar228._0_4_ = local_218 * auVar65._0_4_;
                      auVar228._4_4_ = local_218 * auVar65._4_4_;
                      auVar228._8_4_ = local_218 * auVar65._8_4_;
                      auVar228._12_4_ = local_218 * auVar65._12_4_;
                      auVar65 = vfmadd231ps_fma(auVar228,auVar208,auVar268);
                      auVar191._0_4_ = fVar174 * (float)local_398._0_4_;
                      auVar191._4_4_ = fVar174 * (float)local_398._4_4_;
                      auVar191._8_4_ = fVar174 * fStack_390;
                      auVar191._12_4_ = fVar174 * fStack_38c;
                      auVar128._4_4_ = fVar149;
                      auVar128._0_4_ = fVar149;
                      auVar128._8_4_ = fVar149;
                      auVar128._12_4_ = fVar149;
                      auVar268 = vfmadd132ps_fma(auVar128,auVar191,local_388);
                      auVar169._4_4_ = fVar150;
                      auVar169._0_4_ = fVar150;
                      auVar169._8_4_ = fVar150;
                      auVar169._12_4_ = fVar150;
                      auVar268 = vfmadd132ps_fma(auVar169,auVar268,local_378);
                      auVar192._0_4_ = auVar65._0_4_ * 3.0;
                      auVar192._4_4_ = auVar65._4_4_ * 3.0;
                      auVar192._8_4_ = auVar65._8_4_ * 3.0;
                      auVar192._12_4_ = auVar65._12_4_ * 3.0;
                      auVar146._4_4_ = fVar93;
                      auVar146._0_4_ = fVar93;
                      auVar146._8_4_ = fVar93;
                      auVar146._12_4_ = fVar93;
                      auVar65 = vfmadd132ps_fma(auVar146,auVar268,local_368);
                      auVar268 = vshufps_avx(auVar192,auVar192,0xc9);
                      auVar129._0_4_ = auVar65._0_4_ * auVar268._0_4_;
                      auVar129._4_4_ = auVar65._4_4_ * auVar268._4_4_;
                      auVar129._8_4_ = auVar65._8_4_ * auVar268._8_4_;
                      auVar129._12_4_ = auVar65._12_4_ * auVar268._12_4_;
                      auVar268 = vshufps_avx(auVar65,auVar65,0xc9);
                      auVar268 = vfmsub231ps_fma(auVar129,auVar192,auVar268);
                      local_228 = auVar268._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar63;
                        uVar62 = vextractps_avx(auVar268,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar62;
                        uVar62 = vextractps_avx(auVar268,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar62;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                        *(float *)(ray + k * 4 + 0xf0) = local_218;
                        *(float *)(ray + k * 4 + 0x100) = fVar132;
                        *(uint *)(ray + k * 4 + 0x110) = uVar4;
                        *(uint *)(ray + k * 4 + 0x120) = uVar51;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar65 = vshufps_avx(auVar268,auVar268,0x55);
                        auVar268 = vshufps_avx(auVar268,auVar268,0xaa);
                        local_248[0] = (RTCHitN)auVar65[0];
                        local_248[1] = (RTCHitN)auVar65[1];
                        local_248[2] = (RTCHitN)auVar65[2];
                        local_248[3] = (RTCHitN)auVar65[3];
                        local_248[4] = (RTCHitN)auVar65[4];
                        local_248[5] = (RTCHitN)auVar65[5];
                        local_248[6] = (RTCHitN)auVar65[6];
                        local_248[7] = (RTCHitN)auVar65[7];
                        local_248[8] = (RTCHitN)auVar65[8];
                        local_248[9] = (RTCHitN)auVar65[9];
                        local_248[10] = (RTCHitN)auVar65[10];
                        local_248[0xb] = (RTCHitN)auVar65[0xb];
                        local_248[0xc] = (RTCHitN)auVar65[0xc];
                        local_248[0xd] = (RTCHitN)auVar65[0xd];
                        local_248[0xe] = (RTCHitN)auVar65[0xe];
                        local_248[0xf] = (RTCHitN)auVar65[0xf];
                        local_238 = auVar268;
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_208 = auVar69;
                        local_1f8 = CONCAT44(uStack_3c4,local_3c8);
                        uStack_1f0 = CONCAT44(uStack_3bc,uStack_3c0);
                        local_1e8._4_4_ = uStack_3b4;
                        local_1e8._0_4_ = local_3b8;
                        local_1e8._8_4_ = uStack_3b0;
                        local_1e8._12_4_ = uStack_3ac;
                        vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                        uStack_1d4 = context->user->instID[0];
                        local_1d8 = uStack_1d4;
                        uStack_1d0 = uStack_1d4;
                        uStack_1cc = uStack_1d4;
                        uStack_1c8 = context->user->instPrimID[0];
                        uStack_1c4 = uStack_1c8;
                        uStack_1c0 = uStack_1c8;
                        uStack_1bc = uStack_1c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar63;
                        local_558 = *local_540;
                        uStack_550 = local_540[1];
                        local_538.valid = (int *)&local_558;
                        local_538.geometryUserPtr = pGVar5->userPtr;
                        local_538.context = context->user;
                        local_538.hit = local_248;
                        local_538.N = 4;
                        local_538.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar5->intersectionFilterN)(&local_538);
                          auVar92._8_56_ = extraout_var;
                          auVar92._0_8_ = extraout_XMM1_Qa;
                          auVar268 = auVar92._0_16_;
                        }
                        auVar46._8_8_ = uStack_550;
                        auVar46._0_8_ = local_558;
                        if (auVar46 == (undefined1  [16])0x0) {
                          auVar69 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar268 = vpcmpeqd_avx(auVar268,auVar268);
                          auVar69 = auVar69 ^ auVar268;
                        }
                        else {
                          p_Var6 = context->args->filter;
                          auVar268 = vpcmpeqd_avx(auVar69,auVar69);
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var6)(&local_538);
                            auVar268 = vpcmpeqd_avx(auVar268,auVar268);
                          }
                          auVar47._8_8_ = uStack_550;
                          auVar47._0_8_ = local_558;
                          auVar65 = vpcmpeqd_avx(auVar47,_DAT_01feba10);
                          auVar69 = auVar65 ^ auVar268;
                          if (auVar47 != (undefined1  [16])0x0) {
                            auVar65 = auVar65 ^ auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])local_538.hit);
                            *(undefined1 (*) [16])(local_538.ray + 0xc0) = auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x10));
                            *(undefined1 (*) [16])(local_538.ray + 0xd0) = auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x20));
                            *(undefined1 (*) [16])(local_538.ray + 0xe0) = auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x30));
                            *(undefined1 (*) [16])(local_538.ray + 0xf0) = auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x40));
                            *(undefined1 (*) [16])(local_538.ray + 0x100) = auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x50));
                            *(undefined1 (*) [16])(local_538.ray + 0x110) = auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x60));
                            *(undefined1 (*) [16])(local_538.ray + 0x120) = auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x70));
                            *(undefined1 (*) [16])(local_538.ray + 0x130) = auVar268;
                            auVar268 = vmaskmovps_avx(auVar65,*(undefined1 (*) [16])
                                                               (local_538.hit + 0x80));
                            *(undefined1 (*) [16])(local_538.ray + 0x140) = auVar268;
                          }
                        }
                        auVar89._8_8_ = 0x100000001;
                        auVar89._0_8_ = 0x100000001;
                        if ((auVar89 & auVar69) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar151;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar56 = lVar56 + -1;
            } while (lVar56 != 0);
          }
          else {
            bVar43 = false;
          }
        }
      }
    } while (bVar43);
    local_358 = vinsertps_avx(auVar9,ZEXT416((uint)fVar148),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }